

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [28];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [28];
  undefined1 auVar94 [28];
  undefined1 auVar95 [32];
  int iVar96;
  ulong uVar97;
  RTCIntersectArguments *pRVar98;
  ulong uVar99;
  uint uVar100;
  long lVar101;
  ulong uVar102;
  long lVar103;
  undefined4 uVar104;
  ulong uVar105;
  ulong uVar106;
  undefined4 uVar107;
  undefined8 unaff_R13;
  Geometry *geometry;
  long lVar108;
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined8 uVar109;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined8 uVar110;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar126;
  float fVar128;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar112 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar134 [16];
  undefined8 uVar132;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar135 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined8 uVar133;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar164 [32];
  undefined1 auVar163 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [16];
  undefined1 auVar185 [64];
  float fVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar197 [16];
  undefined4 uVar196;
  undefined1 auVar200 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [16];
  undefined1 auVar213 [64];
  undefined8 uVar216;
  undefined1 auVar214 [32];
  undefined8 uVar217;
  undefined1 auVar215 [32];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined8 uVar222;
  undefined8 uVar223;
  undefined8 uVar224;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  RTCFilterFunctionNArguments args;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  LinearSpace3fa *local_5b0;
  Primitive *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  int local_2e0;
  int local_2dc;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_260 [4];
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar14 = prim[1];
  uVar97 = (ulong)(byte)PVar14;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar97 * 4 + 6);
  auVar193 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar97 * 5 + 6);
  auVar115 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar97 * 6 + 6);
  auVar210 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar97 * 0xf + 6);
  auVar124 = vpmovsxbd_avx2(auVar9);
  lVar101 = uVar97 * 0x25;
  auVar137._1_3_ = 0;
  auVar137[0] = PVar14;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar179 = vpmovsxbd_avx2(auVar186);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar97 * 0x11 + 6);
  auVar125 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar97 * 0x1a + 6);
  auVar114 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar97 * 0x1b + 6);
  auVar144 = vpmovsxbd_avx2(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar97 * 0x1c + 6);
  auVar139 = vpmovsxbd_avx2(auVar13);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  fVar149 = *(float *)(prim + lVar101 + 0x12);
  auVar7 = vsubps_avx(auVar6,*(undefined1 (*) [16])(prim + lVar101 + 6));
  fVar148 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar101 + 0x16)) *
            *(float *)(prim + lVar101 + 0x1a);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar188._0_4_ = fVar149 * auVar7._0_4_;
  auVar188._4_4_ = fVar149 * auVar7._4_4_;
  auVar188._8_4_ = fVar149 * auVar7._8_4_;
  auVar188._12_4_ = fVar149 * auVar7._12_4_;
  auVar209._0_4_ = fVar149 * auVar6._0_4_;
  auVar209._4_4_ = fVar149 * auVar6._4_4_;
  auVar209._8_4_ = fVar149 * auVar6._8_4_;
  auVar209._12_4_ = fVar149 * auVar6._12_4_;
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar210 = vcvtdq2ps_avx(auVar210);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar203 = vcvtdq2ps_avx(auVar139);
  auVar6 = vmovshdup_avx(auVar209);
  auVar146._0_8_ = auVar6._0_8_;
  auVar146._8_8_ = auVar146._0_8_;
  auVar146._16_8_ = auVar146._0_8_;
  auVar146._24_8_ = auVar146._0_8_;
  auVar6 = vshufps_avx(auVar209,auVar209,0xaa);
  fVar149 = auVar6._0_4_;
  auVar206._0_4_ = fVar149 * auVar210._0_4_;
  fVar126 = auVar6._4_4_;
  auVar206._4_4_ = fVar126 * auVar210._4_4_;
  auVar206._8_4_ = fVar149 * auVar210._8_4_;
  auVar206._12_4_ = fVar126 * auVar210._12_4_;
  auVar206._16_4_ = fVar149 * auVar210._16_4_;
  auVar206._20_4_ = fVar126 * auVar210._20_4_;
  auVar206._24_4_ = fVar149 * auVar210._24_4_;
  auVar206._28_4_ = 0;
  auVar158._4_4_ = fVar126 * auVar125._4_4_;
  auVar158._0_4_ = fVar149 * auVar125._0_4_;
  auVar158._8_4_ = fVar149 * auVar125._8_4_;
  auVar158._12_4_ = fVar126 * auVar125._12_4_;
  auVar158._16_4_ = fVar149 * auVar125._16_4_;
  auVar158._20_4_ = fVar126 * auVar125._20_4_;
  auVar158._24_4_ = fVar149 * auVar125._24_4_;
  auVar158._28_4_ = auVar139._28_4_;
  auVar139._4_4_ = fVar126 * auVar203._4_4_;
  auVar139._0_4_ = fVar149 * auVar203._0_4_;
  auVar139._8_4_ = fVar149 * auVar203._8_4_;
  auVar139._12_4_ = fVar126 * auVar203._12_4_;
  auVar139._16_4_ = fVar149 * auVar203._16_4_;
  auVar139._20_4_ = fVar126 * auVar203._20_4_;
  auVar139._24_4_ = fVar149 * auVar203._24_4_;
  auVar139._28_4_ = fVar126;
  auVar7 = vfmadd231ps_fma(auVar206,auVar146,auVar115);
  auVar8 = vfmadd231ps_fma(auVar158,auVar146,auVar179);
  auVar9 = vfmadd231ps_fma(auVar139,auVar144,auVar146);
  auVar6 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar149 = auVar6._0_4_;
  auVar172._0_4_ = fVar149 * auVar210._0_4_;
  fVar126 = auVar6._4_4_;
  auVar172._4_4_ = fVar126 * auVar210._4_4_;
  auVar172._8_4_ = fVar149 * auVar210._8_4_;
  auVar172._12_4_ = fVar126 * auVar210._12_4_;
  auVar172._16_4_ = fVar149 * auVar210._16_4_;
  auVar172._20_4_ = fVar126 * auVar210._20_4_;
  auVar172._24_4_ = fVar149 * auVar210._24_4_;
  auVar172._28_4_ = 0;
  auVar212._4_4_ = fVar126 * auVar125._4_4_;
  auVar212._0_4_ = fVar149 * auVar125._0_4_;
  auVar212._8_4_ = fVar149 * auVar125._8_4_;
  auVar212._12_4_ = fVar126 * auVar125._12_4_;
  auVar212._16_4_ = fVar149 * auVar125._16_4_;
  auVar212._20_4_ = fVar126 * auVar125._20_4_;
  auVar212._24_4_ = fVar149 * auVar125._24_4_;
  auVar212._28_4_ = auVar210._28_4_;
  auVar210._4_4_ = fVar126 * auVar203._4_4_;
  auVar210._0_4_ = fVar149 * auVar203._0_4_;
  auVar210._8_4_ = fVar149 * auVar203._8_4_;
  auVar210._12_4_ = fVar126 * auVar203._12_4_;
  auVar210._16_4_ = fVar149 * auVar203._16_4_;
  auVar210._20_4_ = fVar126 * auVar203._20_4_;
  auVar210._24_4_ = fVar149 * auVar203._24_4_;
  auVar210._28_4_ = auVar203._28_4_;
  auVar6 = vmovshdup_avx(auVar188);
  uVar109 = auVar6._0_8_;
  auVar228._8_8_ = uVar109;
  auVar228._0_8_ = uVar109;
  auVar228._16_8_ = uVar109;
  auVar228._24_8_ = uVar109;
  auVar6 = vfmadd231ps_fma(auVar172,auVar228,auVar115);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 7 + 6));
  auVar186 = vfmadd231ps_fma(auVar212,auVar228,auVar179);
  auVar139 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0xb + 6));
  auVar10 = vfmadd231ps_fma(auVar210,auVar228,auVar144);
  auVar158 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 9 + 6));
  auVar212 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0xd + 6));
  auVar115 = vcvtdq2ps_avx(auVar193);
  auVar210 = vcvtdq2ps_avx(auVar124);
  auVar179 = vcvtdq2ps_avx(auVar114);
  auVar181._4_4_ = auVar209._0_4_;
  auVar181._0_4_ = auVar209._0_4_;
  auVar181._8_4_ = auVar209._0_4_;
  auVar181._12_4_ = auVar209._0_4_;
  auVar181._16_4_ = auVar209._0_4_;
  auVar181._20_4_ = auVar209._0_4_;
  auVar181._24_4_ = auVar209._0_4_;
  auVar181._28_4_ = auVar209._0_4_;
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar181,auVar115);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar181,auVar210);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar179,auVar181);
  auVar193 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x12 + 6));
  auVar182._4_4_ = auVar188._0_4_;
  auVar182._0_4_ = auVar188._0_4_;
  auVar182._8_4_ = auVar188._0_4_;
  auVar182._12_4_ = auVar188._0_4_;
  auVar182._16_4_ = auVar188._0_4_;
  auVar182._20_4_ = auVar188._0_4_;
  auVar182._24_4_ = auVar188._0_4_;
  auVar182._28_4_ = auVar188._0_4_;
  auVar188 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar182,auVar115);
  auVar209 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar182,auVar210);
  auVar111 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar182,auVar179);
  local_3a0._8_4_ = 0x7fffffff;
  local_3a0._0_8_ = 0x7fffffff7fffffff;
  local_3a0._12_4_ = 0x7fffffff;
  local_3a0._16_4_ = 0x7fffffff;
  local_3a0._20_4_ = 0x7fffffff;
  local_3a0._24_4_ = 0x7fffffff;
  local_3a0._28_4_ = 0x7fffffff;
  auVar124._8_4_ = 0x219392ef;
  auVar124._0_8_ = 0x219392ef219392ef;
  auVar124._12_4_ = 0x219392ef;
  auVar124._16_4_ = 0x219392ef;
  auVar124._20_4_ = 0x219392ef;
  auVar124._24_4_ = 0x219392ef;
  auVar124._28_4_ = 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar7),local_3a0);
  auVar115 = vcmpps_avx(auVar115,auVar124,1);
  auVar210 = vblendvps_avx(ZEXT1632(auVar7),auVar124,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar8),local_3a0);
  auVar115 = vcmpps_avx(auVar115,auVar124,1);
  auVar179 = vblendvps_avx(ZEXT1632(auVar8),auVar124,auVar115);
  auVar115 = vandps_avx(ZEXT1632(auVar9),local_3a0);
  auVar115 = vcmpps_avx(auVar115,auVar124,1);
  auVar115 = vblendvps_avx(ZEXT1632(auVar9),auVar124,auVar115);
  auVar203 = vrcpps_avx(auVar210);
  auVar191._4_4_ = fVar148;
  auVar191._0_4_ = fVar148;
  auVar191._8_4_ = fVar148;
  auVar191._12_4_ = fVar148;
  auVar191._16_4_ = fVar148;
  auVar191._20_4_ = fVar148;
  auVar191._24_4_ = fVar148;
  auVar191._28_4_ = fVar148;
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar144 = vcvtdq2ps_avx(auVar139);
  auVar144 = vsubps_avx(auVar144,auVar125);
  auVar9 = vfmadd213ps_fma(auVar144,auVar191,auVar125);
  auVar125 = vcvtdq2ps_avx(auVar158);
  auVar144 = vcvtdq2ps_avx(auVar212);
  auVar144 = vsubps_avx(auVar144,auVar125);
  auVar186 = vfmadd213ps_fma(auVar144,auVar191,auVar125);
  auVar125 = vcvtdq2ps_avx(auVar193);
  auVar144 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x16 + 6));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar144 = vsubps_avx(auVar144,auVar125);
  auVar10 = vfmadd213ps_fma(auVar144,auVar191,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x14 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar144 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x18 + 6));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar144 = vsubps_avx(auVar144,auVar125);
  auVar11 = vfmadd213ps_fma(auVar144,auVar191,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x1d + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar144 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x21 + 6));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar144 = vsubps_avx(auVar144,auVar125);
  auVar12 = vfmadd213ps_fma(auVar144,auVar191,auVar125);
  auVar208 = ZEXT1664(auVar12);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x1f + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar144 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x23 + 6));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar144 = vsubps_avx(auVar144,auVar125);
  auVar13 = vfmadd213ps_fma(auVar144,auVar191,auVar125);
  auVar213 = ZEXT1664(auVar13);
  auVar229._8_4_ = 0x3f800000;
  auVar229._0_8_ = 0x3f8000003f800000;
  auVar229._12_4_ = 0x3f800000;
  auVar229._16_4_ = 0x3f800000;
  auVar229._20_4_ = 0x3f800000;
  auVar229._24_4_ = 0x3f800000;
  auVar229._28_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar210,auVar203,auVar229);
  auVar210 = vrcpps_avx(auVar179);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar203,auVar203);
  auVar7 = vfnmadd213ps_fma(auVar179,auVar210,auVar229);
  auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar210,auVar210);
  auVar210 = vrcpps_avx(auVar115);
  auVar8 = vfnmadd213ps_fma(auVar115,auVar210,auVar229);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar210,auVar210);
  auVar115 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar188));
  auVar179._4_4_ = auVar6._4_4_ * auVar115._4_4_;
  auVar179._0_4_ = auVar6._0_4_ * auVar115._0_4_;
  auVar179._8_4_ = auVar6._8_4_ * auVar115._8_4_;
  auVar179._12_4_ = auVar6._12_4_ * auVar115._12_4_;
  auVar179._16_4_ = auVar115._16_4_ * 0.0;
  auVar179._20_4_ = auVar115._20_4_ * 0.0;
  auVar179._24_4_ = auVar115._24_4_ * 0.0;
  auVar179._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar186),ZEXT1632(auVar188));
  auVar125._4_4_ = auVar6._4_4_ * auVar115._4_4_;
  auVar125._0_4_ = auVar6._0_4_ * auVar115._0_4_;
  auVar125._8_4_ = auVar6._8_4_ * auVar115._8_4_;
  auVar125._12_4_ = auVar6._12_4_ * auVar115._12_4_;
  auVar125._16_4_ = auVar115._16_4_ * 0.0;
  auVar125._20_4_ = auVar115._20_4_ * 0.0;
  auVar125._24_4_ = auVar115._24_4_ * 0.0;
  auVar125._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar209));
  auVar144._4_4_ = auVar7._4_4_ * auVar115._4_4_;
  auVar144._0_4_ = auVar7._0_4_ * auVar115._0_4_;
  auVar144._8_4_ = auVar7._8_4_ * auVar115._8_4_;
  auVar144._12_4_ = auVar7._12_4_ * auVar115._12_4_;
  auVar144._16_4_ = auVar115._16_4_ * 0.0;
  auVar144._20_4_ = auVar115._20_4_ * 0.0;
  auVar144._24_4_ = auVar115._24_4_ * 0.0;
  auVar144._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar209));
  auVar136._0_4_ = auVar7._0_4_ * auVar115._0_4_;
  auVar136._4_4_ = auVar7._4_4_ * auVar115._4_4_;
  auVar136._8_4_ = auVar7._8_4_ * auVar115._8_4_;
  auVar136._12_4_ = auVar7._12_4_ * auVar115._12_4_;
  auVar136._16_4_ = auVar115._16_4_ * 0.0;
  auVar136._20_4_ = auVar115._20_4_ * 0.0;
  auVar136._24_4_ = auVar115._24_4_ * 0.0;
  auVar136._28_4_ = 0;
  auVar115 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar111));
  auVar203._4_4_ = auVar8._4_4_ * auVar115._4_4_;
  auVar203._0_4_ = auVar8._0_4_ * auVar115._0_4_;
  auVar203._8_4_ = auVar8._8_4_ * auVar115._8_4_;
  auVar203._12_4_ = auVar8._12_4_ * auVar115._12_4_;
  auVar203._16_4_ = auVar115._16_4_ * 0.0;
  auVar203._20_4_ = auVar115._20_4_ * 0.0;
  auVar203._24_4_ = auVar115._24_4_ * 0.0;
  auVar203._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar111));
  auVar114._0_4_ = auVar8._0_4_ * auVar115._0_4_;
  auVar114._4_4_ = auVar8._4_4_ * auVar115._4_4_;
  auVar114._8_4_ = auVar8._8_4_ * auVar115._8_4_;
  auVar114._12_4_ = auVar8._12_4_ * auVar115._12_4_;
  auVar114._16_4_ = auVar115._16_4_ * 0.0;
  auVar114._20_4_ = auVar115._20_4_ * 0.0;
  auVar114._24_4_ = auVar115._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar115 = vpminsd_avx2(auVar179,auVar125);
  auVar210 = vpminsd_avx2(auVar144,auVar136);
  auVar115 = vmaxps_avx(auVar115,auVar210);
  auVar210 = vpminsd_avx2(auVar203,auVar114);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar200._4_4_ = uVar107;
  auVar200._0_4_ = uVar107;
  auVar200._8_4_ = uVar107;
  auVar200._12_4_ = uVar107;
  auVar200._16_4_ = uVar107;
  auVar200._20_4_ = uVar107;
  auVar200._24_4_ = uVar107;
  auVar200._28_4_ = uVar107;
  auVar210 = vmaxps_avx(auVar210,auVar200);
  auVar115 = vmaxps_avx(auVar115,auVar210);
  local_80._4_4_ = auVar115._4_4_ * 0.99999964;
  local_80._0_4_ = auVar115._0_4_ * 0.99999964;
  local_80._8_4_ = auVar115._8_4_ * 0.99999964;
  local_80._12_4_ = auVar115._12_4_ * 0.99999964;
  local_80._16_4_ = auVar115._16_4_ * 0.99999964;
  local_80._20_4_ = auVar115._20_4_ * 0.99999964;
  local_80._24_4_ = auVar115._24_4_ * 0.99999964;
  local_80._28_4_ = auVar115._28_4_;
  auVar115 = vpmaxsd_avx2(auVar179,auVar125);
  auVar210 = vpmaxsd_avx2(auVar144,auVar136);
  auVar115 = vminps_avx(auVar115,auVar210);
  auVar210 = vpmaxsd_avx2(auVar203,auVar114);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar164._4_4_ = uVar107;
  auVar164._0_4_ = uVar107;
  auVar164._8_4_ = uVar107;
  auVar164._12_4_ = uVar107;
  auVar164._16_4_ = uVar107;
  auVar164._20_4_ = uVar107;
  auVar164._24_4_ = uVar107;
  auVar164._28_4_ = uVar107;
  auVar210 = vminps_avx(auVar210,auVar164);
  auVar115 = vminps_avx(auVar115,auVar210);
  auVar193._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar193._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar193._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar193._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar193._16_4_ = auVar115._16_4_ * 1.0000004;
  auVar193._20_4_ = auVar115._20_4_ * 1.0000004;
  auVar193._24_4_ = auVar115._24_4_ * 1.0000004;
  auVar193._28_4_ = auVar115._28_4_;
  auVar137[4] = PVar14;
  auVar137._5_3_ = 0;
  auVar137[8] = PVar14;
  auVar137._9_3_ = 0;
  auVar137[0xc] = PVar14;
  auVar137._13_3_ = 0;
  auVar137[0x10] = PVar14;
  auVar137._17_3_ = 0;
  auVar137[0x14] = PVar14;
  auVar137._21_3_ = 0;
  auVar137[0x18] = PVar14;
  auVar137._25_3_ = 0;
  auVar137[0x1c] = PVar14;
  auVar137._29_3_ = 0;
  auVar115 = vcmpps_avx(local_80,auVar193,2);
  auVar210 = vpcmpgtd_avx2(auVar137,_DAT_01fb4ba0);
  auVar115 = vandps_avx(auVar115,auVar210);
  uVar107 = vmovmskps_avx(auVar115);
  uVar97 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar107);
  local_5b0 = pre->ray_space + k;
  local_5a0 = mm_lookupmask_ps._16_8_;
  uStack_598 = mm_lookupmask_ps._24_8_;
  uStack_590 = mm_lookupmask_ps._16_8_;
  uStack_588 = mm_lookupmask_ps._24_8_;
  iVar96 = 1 << ((uint)k & 0x1f);
  auVar115._4_4_ = iVar96;
  auVar115._0_4_ = iVar96;
  auVar115._8_4_ = iVar96;
  auVar115._12_4_ = iVar96;
  auVar115._16_4_ = iVar96;
  auVar115._20_4_ = iVar96;
  auVar115._24_4_ = iVar96;
  auVar115._28_4_ = iVar96;
  auVar210 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar115 = vpand_avx2(auVar115,auVar210);
  local_3c0 = vpcmpeqd_avx2(auVar115,auVar210);
  local_5a8 = prim;
  for (; uVar97 != 0; uVar97 = (ulong)((uint)uVar97 & (uint)uVar97 + 0xff & uVar100)) {
    lVar101 = 0;
    for (uVar102 = uVar97; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
      lVar101 = lVar101 + 1;
    }
    uVar100 = *(uint *)(local_5a8 + 2);
    local_620._4_4_ = *(undefined4 *)(local_5a8 + lVar101 * 4 + 6);
    pGVar15 = (context->scene->geometries).items[uVar100].ptr;
    uVar102 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                              (ulong)(uint)local_620._4_4_ *
                              pGVar15[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar149 = (pGVar15->time_range).lower;
    fVar149 = pGVar15->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar149) / ((pGVar15->time_range).upper - fVar149))
    ;
    auVar6 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
    auVar6 = vminss_avx(auVar6,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
    auVar6 = vmaxss_avx(ZEXT816(0) << 0x20,auVar6);
    fVar149 = fVar149 - auVar6._0_4_;
    _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar103 = (long)(int)auVar6._0_4_ * 0x38;
    lVar101 = *(long *)(_Var16 + 0x10 + lVar103);
    lVar108 = *(long *)(_Var16 + 0x38 + lVar103);
    lVar17 = *(long *)(_Var16 + 0x48 + lVar103);
    pfVar1 = (float *)(lVar108 + uVar102 * lVar17);
    auVar197._0_4_ = fVar149 * *pfVar1;
    auVar197._4_4_ = fVar149 * pfVar1[1];
    auVar197._8_4_ = fVar149 * pfVar1[2];
    auVar197._12_4_ = fVar149 * pfVar1[3];
    pfVar1 = (float *)(lVar108 + (uVar102 + 1) * lVar17);
    auVar150._0_4_ = fVar149 * *pfVar1;
    auVar150._4_4_ = fVar149 * pfVar1[1];
    auVar150._8_4_ = fVar149 * pfVar1[2];
    auVar150._12_4_ = fVar149 * pfVar1[3];
    uVar105 = (uVar102 + 2) * lVar17;
    pfVar1 = (float *)(lVar108 + uVar105);
    auVar162._0_4_ = fVar149 * *pfVar1;
    auVar162._4_4_ = fVar149 * pfVar1[1];
    auVar162._8_4_ = fVar149 * pfVar1[2];
    auVar162._12_4_ = fVar149 * pfVar1[3];
    pfVar1 = (float *)(lVar108 + lVar17 * (uVar102 + 3));
    auVar167._0_4_ = fVar149 * *pfVar1;
    auVar167._4_4_ = fVar149 * pfVar1[1];
    auVar167._8_4_ = fVar149 * pfVar1[2];
    auVar167._12_4_ = fVar149 * pfVar1[3];
    lVar108 = *(long *)(_Var16 + lVar103);
    fVar149 = 1.0 - fVar149;
    auVar111._4_4_ = fVar149;
    auVar111._0_4_ = fVar149;
    auVar111._8_4_ = fVar149;
    auVar111._12_4_ = fVar149;
    auVar10 = vfmadd231ps_fma(auVar197,auVar111,*(undefined1 (*) [16])(lVar108 + lVar101 * uVar102))
    ;
    auVar11 = vfmadd231ps_fma(auVar150,auVar111,
                              *(undefined1 (*) [16])(lVar108 + lVar101 * (uVar102 + 1)));
    auVar12 = vfmadd231ps_fma(auVar162,auVar111,
                              *(undefined1 (*) [16])(lVar108 + lVar101 * (uVar102 + 2)));
    _local_5c0 = vfmadd231ps_fma(auVar167,auVar111,
                                 *(undefined1 (*) [16])(lVar108 + lVar101 * (uVar102 + 3)));
    auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
    auVar9 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    iVar96 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar7 = vsubps_avx(auVar10,auVar9);
    uVar107 = auVar7._0_4_;
    auVar163._4_4_ = uVar107;
    auVar163._0_4_ = uVar107;
    auVar163._8_4_ = uVar107;
    auVar163._12_4_ = uVar107;
    auVar6 = vshufps_avx(auVar7,auVar7,0x55);
    auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
    aVar4 = (local_5b0->vx).field_0;
    aVar5 = (local_5b0->vy).field_0;
    fVar149 = (local_5b0->vz).field_0.m128[0];
    fVar148 = *(float *)((long)&(local_5b0->vz).field_0 + 4);
    fVar126 = *(float *)((long)&(local_5b0->vz).field_0 + 8);
    fVar127 = *(float *)((long)&(local_5b0->vz).field_0 + 0xc);
    auVar205._0_4_ = fVar149 * auVar7._0_4_;
    auVar205._4_4_ = fVar148 * auVar7._4_4_;
    auVar205._8_4_ = fVar126 * auVar7._8_4_;
    auVar205._12_4_ = fVar127 * auVar7._12_4_;
    auVar6 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar5,auVar6);
    auVar13 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar4,auVar163);
    auVar6 = vblendps_avx(auVar13,auVar10,8);
    auVar8 = vsubps_avx(auVar11,auVar9);
    uVar107 = auVar8._0_4_;
    auVar180._4_4_ = uVar107;
    auVar180._0_4_ = uVar107;
    auVar180._8_4_ = uVar107;
    auVar180._12_4_ = uVar107;
    auVar7 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar198._0_4_ = fVar149 * auVar8._0_4_;
    auVar198._4_4_ = fVar148 * auVar8._4_4_;
    auVar198._8_4_ = fVar126 * auVar8._8_4_;
    auVar198._12_4_ = fVar127 * auVar8._12_4_;
    auVar7 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar7);
    auVar188 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar4,auVar180);
    auVar7 = vblendps_avx(auVar188,auVar11,8);
    auVar186 = vsubps_avx(auVar12,auVar9);
    uVar107 = auVar186._0_4_;
    auVar189._4_4_ = uVar107;
    auVar189._0_4_ = uVar107;
    auVar189._8_4_ = uVar107;
    auVar189._12_4_ = uVar107;
    auVar8 = vshufps_avx(auVar186,auVar186,0x55);
    auVar186 = vshufps_avx(auVar186,auVar186,0xaa);
    auVar199._0_4_ = fVar149 * auVar186._0_4_;
    auVar199._4_4_ = fVar148 * auVar186._4_4_;
    auVar199._8_4_ = fVar126 * auVar186._8_4_;
    auVar199._12_4_ = fVar127 * auVar186._12_4_;
    auVar8 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar5,auVar8);
    auVar209 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar4,auVar189);
    auVar8 = vblendps_avx(auVar209,auVar12,8);
    auVar186 = vsubps_avx(_local_5c0,auVar9);
    uVar107 = auVar186._0_4_;
    auVar190._4_4_ = uVar107;
    auVar190._0_4_ = uVar107;
    auVar190._8_4_ = uVar107;
    auVar190._12_4_ = uVar107;
    auVar9 = vshufps_avx(auVar186,auVar186,0x55);
    auVar186 = vshufps_avx(auVar186,auVar186,0xaa);
    auVar134._0_4_ = fVar149 * auVar186._0_4_;
    auVar134._4_4_ = fVar148 * auVar186._4_4_;
    auVar134._8_4_ = fVar126 * auVar186._8_4_;
    auVar134._12_4_ = fVar127 * auVar186._12_4_;
    auVar9 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar5,auVar9);
    auVar111 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar4,auVar190);
    auVar9 = vblendps_avx(auVar111,_local_5c0,8);
    auVar135._8_4_ = 0x7fffffff;
    auVar135._0_8_ = 0x7fffffff7fffffff;
    auVar135._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx(auVar6,auVar135);
    auVar7 = vandps_avx(auVar7,auVar135);
    auVar186 = vmaxps_avx(auVar6,auVar7);
    auVar6 = vandps_avx(auVar8,auVar135);
    auVar7 = vandps_avx(auVar9,auVar135);
    auVar6 = vmaxps_avx(auVar6,auVar7);
    auVar6 = vmaxps_avx(auVar186,auVar6);
    auVar7 = vmovshdup_avx(auVar6);
    auVar7 = vmaxss_avx(auVar7,auVar6);
    auVar6 = vshufpd_avx(auVar6,auVar6,1);
    auVar6 = vmaxss_avx(auVar6,auVar7);
    lVar101 = (long)iVar96 * 0x44;
    auVar7 = vmovshdup_avx(auVar13);
    uVar109 = auVar7._0_8_;
    local_580._8_8_ = uVar109;
    local_580._0_8_ = uVar109;
    local_580._16_8_ = uVar109;
    local_580._24_8_ = uVar109;
    auVar7 = vmovshdup_avx(auVar188);
    uVar109 = auVar7._0_8_;
    local_3e0._8_8_ = uVar109;
    local_3e0._0_8_ = uVar109;
    local_3e0._16_8_ = uVar109;
    local_3e0._24_8_ = uVar109;
    auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar101 + 0x908);
    uVar196 = auVar209._0_4_;
    auVar173._4_4_ = uVar196;
    auVar173._0_4_ = uVar196;
    auVar173._8_4_ = uVar196;
    auVar173._12_4_ = uVar196;
    auVar173._16_4_ = uVar196;
    auVar173._20_4_ = uVar196;
    auVar173._24_4_ = uVar196;
    auVar173._28_4_ = uVar196;
    auVar8 = vmovshdup_avx(auVar209);
    uVar109 = auVar8._0_8_;
    auVar214._8_8_ = uVar109;
    auVar214._0_8_ = uVar109;
    auVar214._16_8_ = uVar109;
    auVar214._24_8_ = uVar109;
    local_460 = *(float *)(catmullrom_basis0 + lVar101 + 0xd8c);
    fStack_45c = *(float *)(catmullrom_basis0 + lVar101 + 0xd90);
    fStack_458 = *(float *)(catmullrom_basis0 + lVar101 + 0xd94);
    fStack_454 = *(float *)(catmullrom_basis0 + lVar101 + 0xd98);
    fStack_450 = *(float *)(catmullrom_basis0 + lVar101 + 0xd9c);
    fStack_44c = *(float *)(catmullrom_basis0 + lVar101 + 0xda0);
    fStack_448 = *(float *)(catmullrom_basis0 + lVar101 + 0xda4);
    fStack_444 = *(float *)(catmullrom_basis0 + lVar101 + 0xda8);
    auVar8 = vmovshdup_avx(auVar111);
    uVar110 = auVar8._0_8_;
    fVar187 = auVar111._0_4_;
    auVar138._0_4_ = local_460 * fVar187;
    auVar138._4_4_ = fStack_45c * fVar187;
    auVar138._8_4_ = fStack_458 * fVar187;
    auVar138._12_4_ = fStack_454 * fVar187;
    auVar138._16_4_ = fStack_450 * fVar187;
    auVar138._20_4_ = fStack_44c * fVar187;
    auVar138._24_4_ = fStack_448 * fVar187;
    auVar138._28_4_ = 0;
    auVar9 = vfmadd231ps_fma(auVar138,auVar115,auVar173);
    fVar218 = auVar8._0_4_;
    auVar116._0_4_ = fVar218 * local_460;
    fVar220 = auVar8._4_4_;
    auVar116._4_4_ = fVar220 * fStack_45c;
    auVar116._8_4_ = fVar218 * fStack_458;
    auVar116._12_4_ = fVar220 * fStack_454;
    auVar116._16_4_ = fVar218 * fStack_450;
    auVar116._20_4_ = fVar220 * fStack_44c;
    auVar116._24_4_ = fVar218 * fStack_448;
    auVar116._28_4_ = 0;
    auVar8 = vfmadd231ps_fma(auVar116,auVar115,auVar214);
    auVar210 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar101 + 0x484);
    uVar107 = auVar188._0_4_;
    auVar225._4_4_ = uVar107;
    auVar225._0_4_ = uVar107;
    auVar225._8_4_ = uVar107;
    auVar225._12_4_ = uVar107;
    auVar225._16_4_ = uVar107;
    auVar225._20_4_ = uVar107;
    auVar225._24_4_ = uVar107;
    auVar225._28_4_ = uVar107;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar210,auVar225);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar210,local_3e0);
    auVar179 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar101);
    auVar207._0_4_ = auVar13._0_4_;
    auVar207._4_4_ = auVar207._0_4_;
    auVar207._8_4_ = auVar207._0_4_;
    auVar207._12_4_ = auVar207._0_4_;
    auVar207._16_4_ = auVar207._0_4_;
    auVar207._20_4_ = auVar207._0_4_;
    auVar207._24_4_ = auVar207._0_4_;
    auVar207._28_4_ = auVar207._0_4_;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar179,auVar207);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar179,local_580);
    local_4a0 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar101 + 0x908);
    fVar81 = *(float *)(catmullrom_basis1 + lVar101 + 0xd8c);
    fVar82 = *(float *)(catmullrom_basis1 + lVar101 + 0xd90);
    fVar83 = *(float *)(catmullrom_basis1 + lVar101 + 0xd94);
    fVar84 = *(float *)(catmullrom_basis1 + lVar101 + 0xd98);
    fVar85 = *(float *)(catmullrom_basis1 + lVar101 + 0xd9c);
    fVar86 = *(float *)(catmullrom_basis1 + lVar101 + 0xda0);
    fVar87 = *(float *)(catmullrom_basis1 + lVar101 + 0xda4);
    auVar19._4_4_ = fVar82 * fVar187;
    auVar19._0_4_ = fVar81 * fVar187;
    auVar19._8_4_ = fVar83 * fVar187;
    auVar19._12_4_ = fVar84 * fVar187;
    auVar19._16_4_ = fVar85 * fVar187;
    auVar19._20_4_ = fVar86 * fVar187;
    auVar19._24_4_ = fVar87 * fVar187;
    auVar19._28_4_ = fVar187;
    auVar186 = vfmadd231ps_fma(auVar19,local_4a0,auVar173);
    auVar20._4_4_ = fVar220 * fVar82;
    auVar20._0_4_ = fVar218 * fVar81;
    auVar20._8_4_ = fVar218 * fVar83;
    auVar20._12_4_ = fVar220 * fVar84;
    auVar20._16_4_ = fVar218 * fVar85;
    auVar20._20_4_ = fVar220 * fVar86;
    auVar20._24_4_ = fVar218 * fVar87;
    auVar20._28_4_ = uVar196;
    auVar134 = vfmadd231ps_fma(auVar20,local_4a0,auVar214);
    auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar101 + 0x484);
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar125,auVar225);
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar125,local_3e0);
    auVar144 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar101);
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar144,auVar207);
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar144,local_580);
    local_420 = ZEXT1632(auVar186);
    auVar139 = ZEXT1632(auVar9);
    auVar124 = vsubps_avx(local_420,auVar139);
    local_440 = ZEXT1632(auVar134);
    _local_560 = ZEXT1632(auVar8);
    local_480 = vsubps_avx(local_440,_local_560);
    auVar117._0_4_ = auVar124._0_4_ * auVar8._0_4_;
    auVar117._4_4_ = auVar124._4_4_ * auVar8._4_4_;
    auVar117._8_4_ = auVar124._8_4_ * auVar8._8_4_;
    auVar117._12_4_ = auVar124._12_4_ * auVar8._12_4_;
    auVar117._16_4_ = auVar124._16_4_ * 0.0;
    auVar117._20_4_ = auVar124._20_4_ * 0.0;
    auVar117._24_4_ = auVar124._24_4_ * 0.0;
    auVar117._28_4_ = 0;
    fVar149 = local_480._0_4_;
    auVar140._0_4_ = auVar9._0_4_ * fVar149;
    fVar126 = local_480._4_4_;
    auVar140._4_4_ = auVar9._4_4_ * fVar126;
    fVar128 = local_480._8_4_;
    auVar140._8_4_ = auVar9._8_4_ * fVar128;
    fVar129 = local_480._12_4_;
    auVar140._12_4_ = auVar9._12_4_ * fVar129;
    fVar130 = local_480._16_4_;
    auVar140._16_4_ = fVar130 * 0.0;
    fVar131 = local_480._20_4_;
    auVar140._20_4_ = fVar131 * 0.0;
    fVar219 = local_480._24_4_;
    auVar140._24_4_ = fVar219 * 0.0;
    auVar140._28_4_ = 0;
    auVar193 = vsubps_avx(auVar117,auVar140);
    auVar8 = vpermilps_avx(auVar10,0xff);
    uVar109 = auVar8._0_8_;
    local_a0._8_8_ = uVar109;
    local_a0._0_8_ = uVar109;
    local_a0._16_8_ = uVar109;
    local_a0._24_8_ = uVar109;
    auVar9 = vpermilps_avx(auVar11,0xff);
    uVar109 = auVar9._0_8_;
    local_c0._8_8_ = uVar109;
    local_c0._0_8_ = uVar109;
    local_c0._16_8_ = uVar109;
    local_c0._24_8_ = uVar109;
    auVar9 = vpermilps_avx(auVar12,0xff);
    uVar109 = auVar9._0_8_;
    local_e0._8_8_ = uVar109;
    local_e0._0_8_ = uVar109;
    local_e0._16_8_ = uVar109;
    local_e0._24_8_ = uVar109;
    auVar9 = vpermilps_avx(_local_5c0,0xff);
    uVar109 = auVar9._0_8_;
    fVar148 = auVar9._0_4_;
    fVar127 = auVar9._4_4_;
    auVar21._4_4_ = fStack_45c * fVar127;
    auVar21._0_4_ = local_460 * fVar148;
    auVar21._8_4_ = fStack_458 * fVar148;
    auVar21._12_4_ = fStack_454 * fVar127;
    auVar21._16_4_ = fStack_450 * fVar148;
    auVar21._20_4_ = fStack_44c * fVar127;
    auVar21._24_4_ = fStack_448 * fVar148;
    auVar21._28_4_ = fStack_444;
    auVar9 = vfmadd231ps_fma(auVar21,local_e0,auVar115);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar210,local_c0);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar179,local_a0);
    auVar22._4_4_ = fVar82 * fVar127;
    auVar22._0_4_ = fVar81 * fVar148;
    auVar22._8_4_ = fVar83 * fVar148;
    auVar22._12_4_ = fVar84 * fVar127;
    auVar22._16_4_ = fVar85 * fVar148;
    auVar22._20_4_ = fVar86 * fVar127;
    auVar22._24_4_ = fVar87 * fVar148;
    auVar22._28_4_ = uVar107;
    auVar186 = vfmadd231ps_fma(auVar22,local_4a0,local_e0);
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar125,local_c0);
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar144,local_a0);
    auVar23._4_4_ = fVar126 * fVar126;
    auVar23._0_4_ = fVar149 * fVar149;
    auVar23._8_4_ = fVar128 * fVar128;
    auVar23._12_4_ = fVar129 * fVar129;
    auVar23._16_4_ = fVar130 * fVar130;
    auVar23._20_4_ = fVar131 * fVar131;
    auVar23._24_4_ = fVar219 * fVar219;
    auVar23._28_4_ = auVar8._4_4_;
    auVar8 = vfmadd231ps_fma(auVar23,auVar124,auVar124);
    auVar203 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar186));
    auVar24._4_4_ = auVar203._4_4_ * auVar203._4_4_ * auVar8._4_4_;
    auVar24._0_4_ = auVar203._0_4_ * auVar203._0_4_ * auVar8._0_4_;
    auVar24._8_4_ = auVar203._8_4_ * auVar203._8_4_ * auVar8._8_4_;
    auVar24._12_4_ = auVar203._12_4_ * auVar203._12_4_ * auVar8._12_4_;
    auVar24._16_4_ = auVar203._16_4_ * auVar203._16_4_ * 0.0;
    auVar24._20_4_ = auVar203._20_4_ * auVar203._20_4_ * 0.0;
    auVar24._24_4_ = auVar203._24_4_ * auVar203._24_4_ * 0.0;
    auVar24._28_4_ = auVar203._28_4_;
    auVar25._4_4_ = auVar193._4_4_ * auVar193._4_4_;
    auVar25._0_4_ = auVar193._0_4_ * auVar193._0_4_;
    auVar25._8_4_ = auVar193._8_4_ * auVar193._8_4_;
    auVar25._12_4_ = auVar193._12_4_ * auVar193._12_4_;
    auVar25._16_4_ = auVar193._16_4_ * auVar193._16_4_;
    auVar25._20_4_ = auVar193._20_4_ * auVar193._20_4_;
    auVar25._24_4_ = auVar193._24_4_ * auVar193._24_4_;
    auVar25._28_4_ = auVar193._28_4_;
    auVar203 = vcmpps_avx(auVar25,auVar24,2);
    fVar149 = auVar6._0_4_ * 4.7683716e-07;
    auVar118._0_4_ = (float)iVar96;
    register0x00001444 = auVar210._4_12_;
    auVar118._4_4_ = auVar118._0_4_;
    auVar118._8_4_ = auVar118._0_4_;
    auVar118._12_4_ = auVar118._0_4_;
    auVar118._16_4_ = auVar118._0_4_;
    auVar118._20_4_ = auVar118._0_4_;
    auVar118._24_4_ = auVar118._0_4_;
    auVar118._28_4_ = auVar118._0_4_;
    auVar193 = vcmpps_avx(_DAT_01f7b060,auVar118,1);
    auVar6 = vpermilps_avx(auVar13,0xaa);
    uVar132 = auVar6._0_8_;
    auVar230._8_8_ = uVar132;
    auVar230._0_8_ = uVar132;
    auVar230._16_8_ = uVar132;
    auVar230._24_8_ = uVar132;
    auVar8 = vpermilps_avx(auVar188,0xaa);
    uVar132 = auVar8._0_8_;
    local_400._8_8_ = uVar132;
    local_400._0_8_ = uVar132;
    local_400._16_8_ = uVar132;
    local_400._24_8_ = uVar132;
    auVar8 = vpermilps_avx(auVar209,0xaa);
    uVar132 = auVar8._0_8_;
    local_520._8_8_ = uVar132;
    local_520._0_8_ = uVar132;
    local_520._16_8_ = uVar132;
    local_520._24_8_ = uVar132;
    auVar8 = vpermilps_avx(auVar111,0xaa);
    uVar133 = auVar8._0_8_;
    auVar114 = auVar193 & auVar203;
    _local_6a0 = ZEXT416((uint)local_620._4_4_);
    uVar107 = *(undefined4 *)(ray + k * 4 + 0x60);
    local_6f0 = auVar10._0_8_;
    uStack_6e8 = auVar10._8_8_;
    local_700 = auVar11._0_8_;
    uStack_6f8 = auVar11._8_8_;
    local_710 = auVar12._0_8_;
    uStack_708 = auVar12._8_8_;
    uVar132 = uVar109;
    uVar216 = uVar109;
    uVar217 = uVar109;
    uVar222 = uVar133;
    uVar223 = uVar133;
    uVar224 = uVar133;
    local_540._0_4_ = auVar118._0_4_;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      uVar105 = 0;
      auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,CONCAT416(fVar218,
                                                  CONCAT412(fVar220,CONCAT48(fVar218,uVar110)))))));
      auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,CONCAT416(fVar187,
                                                  CONCAT412(fVar187,CONCAT48(fVar187,CONCAT44(
                                                  fVar187,fVar187))))))));
    }
    else {
      _local_4c0 = vandps_avx(auVar203,auVar193);
      fVar219 = auVar8._0_4_;
      fVar221 = auVar8._4_4_;
      auVar26._4_4_ = fVar221 * fVar82;
      auVar26._0_4_ = fVar219 * fVar81;
      auVar26._8_4_ = fVar219 * fVar83;
      auVar26._12_4_ = fVar221 * fVar84;
      auVar26._16_4_ = fVar219 * fVar85;
      auVar26._20_4_ = fVar221 * fVar86;
      auVar26._24_4_ = fVar219 * fVar87;
      auVar26._28_4_ = local_4c0._28_4_;
      auVar8 = vfmadd213ps_fma(local_4a0,local_520,auVar26);
      auVar8 = vfmadd213ps_fma(auVar125,local_400,ZEXT1632(auVar8));
      auVar8 = vfmadd213ps_fma(auVar144,auVar230,ZEXT1632(auVar8));
      auVar119._0_4_ = fVar219 * local_460;
      auVar119._4_4_ = fVar221 * fStack_45c;
      auVar119._8_4_ = fVar219 * fStack_458;
      auVar119._12_4_ = fVar221 * fStack_454;
      auVar119._16_4_ = fVar219 * fStack_450;
      auVar119._20_4_ = fVar221 * fStack_44c;
      auVar119._24_4_ = fVar219 * fStack_448;
      auVar119._28_4_ = 0;
      auVar13 = vfmadd213ps_fma(auVar115,local_520,auVar119);
      auVar13 = vfmadd213ps_fma(auVar210,local_400,ZEXT1632(auVar13));
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar101 + 0x1210);
      auVar210 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar101 + 0x1694);
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar101 + 0x1b18);
      fVar148 = *(float *)(catmullrom_basis0 + lVar101 + 0x1f9c);
      fVar126 = *(float *)(catmullrom_basis0 + lVar101 + 0x1fa0);
      fVar127 = *(float *)(catmullrom_basis0 + lVar101 + 0x1fa4);
      fVar128 = *(float *)(catmullrom_basis0 + lVar101 + 0x1fa8);
      fVar129 = *(float *)(catmullrom_basis0 + lVar101 + 0x1fac);
      fVar130 = *(float *)(catmullrom_basis0 + lVar101 + 0x1fb0);
      fVar131 = *(float *)(catmullrom_basis0 + lVar101 + 0x1fb4);
      auVar175._0_4_ = fVar148 * fVar187;
      auVar175._4_4_ = fVar126 * fVar187;
      auVar175._8_4_ = fVar127 * fVar187;
      auVar175._12_4_ = fVar128 * fVar187;
      auVar175._16_4_ = fVar129 * fVar187;
      auVar175._20_4_ = fVar130 * fVar187;
      auVar175._24_4_ = fVar131 * fVar187;
      auVar175._28_4_ = 0;
      auVar27._4_4_ = fVar220 * fVar126;
      auVar27._0_4_ = fVar218 * fVar148;
      auVar27._8_4_ = fVar218 * fVar127;
      auVar27._12_4_ = fVar220 * fVar128;
      auVar27._16_4_ = fVar218 * fVar129;
      auVar27._20_4_ = fVar220 * fVar130;
      auVar27._24_4_ = fVar218 * fVar131;
      auVar27._28_4_ = *(undefined4 *)(catmullrom_basis1 + lVar101 + 0xda8);
      auVar28._4_4_ = fVar221 * fVar126;
      auVar28._0_4_ = fVar219 * fVar148;
      auVar28._8_4_ = fVar219 * fVar127;
      auVar28._12_4_ = fVar221 * fVar128;
      auVar28._16_4_ = fVar219 * fVar129;
      auVar28._20_4_ = fVar221 * fVar130;
      auVar28._24_4_ = fVar219 * fVar131;
      auVar28._28_4_ = auVar124._28_4_;
      auVar188 = vfmadd231ps_fma(auVar175,auVar125,auVar173);
      auVar209 = vfmadd231ps_fma(auVar27,auVar125,auVar214);
      auVar111 = vfmadd231ps_fma(auVar28,local_520,auVar125);
      auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar210,auVar225);
      auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar210,local_3e0);
      auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_400,auVar210);
      auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar115,auVar207);
      auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar115,local_580);
      auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar230,auVar115);
      fVar148 = *(float *)(catmullrom_basis1 + lVar101 + 0x1f9c);
      fVar126 = *(float *)(catmullrom_basis1 + lVar101 + 0x1fa0);
      fVar127 = *(float *)(catmullrom_basis1 + lVar101 + 0x1fa4);
      fVar128 = *(float *)(catmullrom_basis1 + lVar101 + 0x1fa8);
      fVar129 = *(float *)(catmullrom_basis1 + lVar101 + 0x1fac);
      fVar130 = *(float *)(catmullrom_basis1 + lVar101 + 0x1fb0);
      fVar131 = *(float *)(catmullrom_basis1 + lVar101 + 0x1fb4);
      auVar29._4_4_ = fVar187 * fVar126;
      auVar29._0_4_ = fVar187 * fVar148;
      auVar29._8_4_ = fVar187 * fVar127;
      auVar29._12_4_ = fVar187 * fVar128;
      auVar29._16_4_ = fVar187 * fVar129;
      auVar29._20_4_ = fVar187 * fVar130;
      auVar29._24_4_ = fVar187 * fVar131;
      auVar29._28_4_ = fVar187;
      auVar30._4_4_ = fVar220 * fVar126;
      auVar30._0_4_ = fVar218 * fVar148;
      auVar30._8_4_ = fVar218 * fVar127;
      auVar30._12_4_ = fVar220 * fVar128;
      auVar30._16_4_ = fVar218 * fVar129;
      auVar30._20_4_ = fVar220 * fVar130;
      auVar30._24_4_ = fVar218 * fVar131;
      auVar30._28_4_ = fVar220;
      auVar31._4_4_ = fVar221 * fVar126;
      auVar31._0_4_ = fVar219 * fVar148;
      auVar31._8_4_ = fVar219 * fVar127;
      auVar31._12_4_ = fVar221 * fVar128;
      auVar31._16_4_ = fVar219 * fVar129;
      auVar31._20_4_ = fVar221 * fVar130;
      auVar31._24_4_ = fVar219 * fVar131;
      auVar31._28_4_ = fVar221;
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar101 + 0x1b18);
      auVar134 = vfmadd231ps_fma(auVar29,auVar115,auVar173);
      auVar135 = vfmadd231ps_fma(auVar30,auVar115,auVar214);
      auVar150 = vfmadd231ps_fma(auVar31,auVar115,local_520);
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar101 + 0x1694);
      auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar115,auVar225);
      auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar115,local_3e0);
      auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),local_400,auVar115);
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar101 + 0x1210);
      auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar115,auVar207);
      auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar115,local_580);
      auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar230,auVar115);
      auVar115 = vandps_avx(local_3a0,ZEXT1632(auVar188));
      auVar210 = vandps_avx(ZEXT1632(auVar209),local_3a0);
      auVar210 = vmaxps_avx(auVar115,auVar210);
      auVar115 = vandps_avx(ZEXT1632(auVar111),local_3a0);
      auVar115 = vmaxps_avx(auVar210,auVar115);
      auVar141._4_4_ = fVar149;
      auVar141._0_4_ = fVar149;
      auVar141._8_4_ = fVar149;
      auVar141._12_4_ = fVar149;
      auVar141._16_4_ = fVar149;
      auVar141._20_4_ = fVar149;
      auVar141._24_4_ = fVar149;
      auVar141._28_4_ = fVar149;
      auVar115 = vcmpps_avx(auVar115,auVar141,1);
      auVar125 = vblendvps_avx(ZEXT1632(auVar188),auVar124,auVar115);
      auVar144 = vblendvps_avx(ZEXT1632(auVar209),local_480,auVar115);
      auVar115 = vandps_avx(local_3a0,ZEXT1632(auVar134));
      auVar210 = vandps_avx(ZEXT1632(auVar135),local_3a0);
      auVar210 = vmaxps_avx(auVar115,auVar210);
      auVar115 = vandps_avx(ZEXT1632(auVar150),local_3a0);
      auVar115 = vmaxps_avx(auVar210,auVar115);
      auVar210 = vcmpps_avx(auVar115,auVar141,1);
      auVar115 = vblendvps_avx(ZEXT1632(auVar134),auVar124,auVar210);
      auVar210 = vblendvps_avx(ZEXT1632(auVar135),local_480,auVar210);
      auVar13 = vfmadd213ps_fma(auVar179,auVar230,ZEXT1632(auVar13));
      auVar188 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
      auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar144,auVar144);
      auVar179 = vrsqrtps_avx(ZEXT1632(auVar188));
      fVar148 = auVar179._0_4_;
      fVar126 = auVar179._4_4_;
      fVar127 = auVar179._8_4_;
      fVar128 = auVar179._12_4_;
      fVar129 = auVar179._16_4_;
      fVar130 = auVar179._20_4_;
      fVar131 = auVar179._24_4_;
      auVar32._4_4_ = fVar126 * fVar126 * fVar126 * auVar188._4_4_ * -0.5;
      auVar32._0_4_ = fVar148 * fVar148 * fVar148 * auVar188._0_4_ * -0.5;
      auVar32._8_4_ = fVar127 * fVar127 * fVar127 * auVar188._8_4_ * -0.5;
      auVar32._12_4_ = fVar128 * fVar128 * fVar128 * auVar188._12_4_ * -0.5;
      auVar32._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar32._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar32._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar32._28_4_ = 0;
      auVar183._8_4_ = 0x3fc00000;
      auVar183._0_8_ = 0x3fc000003fc00000;
      auVar183._12_4_ = 0x3fc00000;
      auVar183._16_4_ = 0x3fc00000;
      auVar183._20_4_ = 0x3fc00000;
      auVar183._24_4_ = 0x3fc00000;
      auVar183._28_4_ = 0x3fc00000;
      auVar188 = vfmadd231ps_fma(auVar32,auVar183,auVar179);
      fVar148 = auVar188._0_4_;
      fVar126 = auVar188._4_4_;
      auVar33._4_4_ = auVar144._4_4_ * fVar126;
      auVar33._0_4_ = auVar144._0_4_ * fVar148;
      fVar127 = auVar188._8_4_;
      auVar33._8_4_ = auVar144._8_4_ * fVar127;
      fVar128 = auVar188._12_4_;
      auVar33._12_4_ = auVar144._12_4_ * fVar128;
      auVar33._16_4_ = auVar144._16_4_ * 0.0;
      auVar33._20_4_ = auVar144._20_4_ * 0.0;
      auVar33._24_4_ = auVar144._24_4_ * 0.0;
      auVar33._28_4_ = auVar179._28_4_;
      auVar34._4_4_ = -auVar125._4_4_ * fVar126;
      auVar34._0_4_ = -auVar125._0_4_ * fVar148;
      auVar34._8_4_ = -auVar125._8_4_ * fVar127;
      auVar34._12_4_ = -auVar125._12_4_ * fVar128;
      auVar34._16_4_ = -auVar125._16_4_ * 0.0;
      auVar34._20_4_ = -auVar125._20_4_ * 0.0;
      auVar34._24_4_ = -auVar125._24_4_ * 0.0;
      auVar34._28_4_ = 0;
      auVar188 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
      auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar210,auVar210);
      auVar179 = vrsqrtps_avx(ZEXT1632(auVar188));
      auVar35._28_4_ = auVar7._4_4_;
      auVar35._0_28_ =
           ZEXT1628(CONCAT412(fVar128 * 0.0,
                              CONCAT48(fVar127 * 0.0,CONCAT44(fVar126 * 0.0,fVar148 * 0.0))));
      fVar148 = auVar179._0_4_;
      fVar126 = auVar179._4_4_;
      fVar127 = auVar179._8_4_;
      fVar128 = auVar179._12_4_;
      fVar129 = auVar179._16_4_;
      fVar130 = auVar179._20_4_;
      fVar131 = auVar179._24_4_;
      auVar36._4_4_ = fVar126 * fVar126 * fVar126 * auVar188._4_4_ * -0.5;
      auVar36._0_4_ = fVar148 * fVar148 * fVar148 * auVar188._0_4_ * -0.5;
      auVar36._8_4_ = fVar127 * fVar127 * fVar127 * auVar188._8_4_ * -0.5;
      auVar36._12_4_ = fVar128 * fVar128 * fVar128 * auVar188._12_4_ * -0.5;
      auVar36._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar36._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar36._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar36._28_4_ = 0xbf000000;
      auVar7 = vfmadd231ps_fma(auVar36,auVar183,auVar179);
      fVar148 = auVar7._0_4_;
      fVar126 = auVar7._4_4_;
      auVar37._4_4_ = fVar126 * auVar210._4_4_;
      auVar37._0_4_ = fVar148 * auVar210._0_4_;
      fVar127 = auVar7._8_4_;
      auVar37._8_4_ = fVar127 * auVar210._8_4_;
      fVar128 = auVar7._12_4_;
      auVar37._12_4_ = fVar128 * auVar210._12_4_;
      auVar37._16_4_ = auVar210._16_4_ * 0.0;
      auVar37._20_4_ = auVar210._20_4_ * 0.0;
      auVar37._24_4_ = auVar210._24_4_ * 0.0;
      auVar37._28_4_ = auVar6._4_4_;
      auVar38._4_4_ = fVar126 * -auVar115._4_4_;
      auVar38._0_4_ = fVar148 * -auVar115._0_4_;
      auVar38._8_4_ = fVar127 * -auVar115._8_4_;
      auVar38._12_4_ = fVar128 * -auVar115._12_4_;
      auVar38._16_4_ = -auVar115._16_4_ * 0.0;
      auVar38._20_4_ = -auVar115._20_4_ * 0.0;
      auVar38._24_4_ = -auVar115._24_4_ * 0.0;
      auVar38._28_4_ = auVar115._28_4_ ^ 0x80000000;
      auVar115 = ZEXT1632(CONCAT412(fVar128 * 0.0,
                                    CONCAT48(fVar127 * 0.0,CONCAT44(fVar126 * 0.0,fVar148 * 0.0))));
      auVar6 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar9),auVar139);
      auVar210 = ZEXT1632(auVar9);
      auVar7 = vfmadd213ps_fma(auVar34,auVar210,_local_560);
      auVar188 = vfmadd213ps_fma(auVar35,auVar210,ZEXT1632(auVar13));
      auVar134 = vfnmadd213ps_fma(auVar33,auVar210,auVar139);
      auVar209 = vfmadd213ps_fma(auVar37,ZEXT1632(auVar186),local_420);
      auVar135 = vfnmadd213ps_fma(auVar34,auVar210,_local_560);
      auVar210 = ZEXT1632(auVar186);
      auVar111 = vfmadd213ps_fma(auVar38,auVar210,local_440);
      auVar146 = ZEXT1632(auVar9);
      auVar163 = vfnmadd231ps_fma(ZEXT1632(auVar13),auVar146,auVar35);
      auVar9 = vfmadd213ps_fma(auVar115,auVar210,ZEXT1632(auVar8));
      auVar150 = vfnmadd213ps_fma(auVar37,auVar210,local_420);
      auVar162 = vfnmadd213ps_fma(auVar38,auVar210,local_440);
      auVar167 = vfnmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar186),auVar115);
      auVar115 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar135));
      auVar210 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar163));
      auVar39._4_4_ = auVar163._4_4_ * auVar115._4_4_;
      auVar39._0_4_ = auVar163._0_4_ * auVar115._0_4_;
      auVar39._8_4_ = auVar163._8_4_ * auVar115._8_4_;
      auVar39._12_4_ = auVar163._12_4_ * auVar115._12_4_;
      auVar39._16_4_ = auVar115._16_4_ * 0.0;
      auVar39._20_4_ = auVar115._20_4_ * 0.0;
      auVar39._24_4_ = auVar115._24_4_ * 0.0;
      auVar39._28_4_ = 0;
      auVar13 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar135),auVar210);
      auVar40._4_4_ = auVar134._4_4_ * auVar210._4_4_;
      auVar40._0_4_ = auVar134._0_4_ * auVar210._0_4_;
      auVar40._8_4_ = auVar134._8_4_ * auVar210._8_4_;
      auVar40._12_4_ = auVar134._12_4_ * auVar210._12_4_;
      auVar40._16_4_ = auVar210._16_4_ * 0.0;
      auVar40._20_4_ = auVar210._20_4_ * 0.0;
      auVar40._24_4_ = auVar210._24_4_ * 0.0;
      auVar40._28_4_ = auVar210._28_4_;
      auVar193 = ZEXT1632(auVar134);
      auVar210 = vsubps_avx(ZEXT1632(auVar209),auVar193);
      auVar8 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar163),auVar210);
      auVar41._4_4_ = auVar135._4_4_ * auVar210._4_4_;
      auVar41._0_4_ = auVar135._0_4_ * auVar210._0_4_;
      auVar41._8_4_ = auVar135._8_4_ * auVar210._8_4_;
      auVar41._12_4_ = auVar135._12_4_ * auVar210._12_4_;
      auVar41._16_4_ = auVar210._16_4_ * 0.0;
      auVar41._20_4_ = auVar210._20_4_ * 0.0;
      auVar41._24_4_ = auVar210._24_4_ * 0.0;
      auVar41._28_4_ = auVar210._28_4_;
      auVar134 = vfmsub231ps_fma(auVar41,auVar193,auVar115);
      auVar115 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar115,ZEXT1632(auVar8));
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar115,ZEXT1632(auVar13));
      auVar139 = vcmpps_avx(ZEXT1632(auVar8),ZEXT1232(ZEXT812(0)) << 0x20,2);
      auVar115 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar6),auVar139);
      auVar210 = vblendvps_avx(ZEXT1632(auVar162),ZEXT1632(auVar7),auVar139);
      auVar179 = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar188),auVar139);
      auVar125 = vblendvps_avx(auVar193,ZEXT1632(auVar209),auVar139);
      auVar144 = vblendvps_avx(ZEXT1632(auVar135),ZEXT1632(auVar111),auVar139);
      auVar203 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar9),auVar139);
      auVar193 = vblendvps_avx(ZEXT1632(auVar209),auVar193,auVar139);
      auVar124 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar135),auVar139);
      auVar6 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
      auVar114 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar163),auVar139);
      auVar158 = vsubps_avx(auVar193,auVar115);
      auVar124 = vsubps_avx(auVar124,auVar210);
      auVar212 = vsubps_avx(auVar114,auVar179);
      auVar136 = vsubps_avx(auVar115,auVar125);
      auVar137 = vsubps_avx(auVar210,auVar144);
      auVar164 = vsubps_avx(auVar179,auVar203);
      auVar42._4_4_ = auVar212._4_4_ * auVar115._4_4_;
      auVar42._0_4_ = auVar212._0_4_ * auVar115._0_4_;
      auVar42._8_4_ = auVar212._8_4_ * auVar115._8_4_;
      auVar42._12_4_ = auVar212._12_4_ * auVar115._12_4_;
      auVar42._16_4_ = auVar212._16_4_ * auVar115._16_4_;
      auVar42._20_4_ = auVar212._20_4_ * auVar115._20_4_;
      auVar42._24_4_ = auVar212._24_4_ * auVar115._24_4_;
      auVar42._28_4_ = auVar114._28_4_;
      auVar7 = vfmsub231ps_fma(auVar42,auVar179,auVar158);
      auVar43._4_4_ = auVar158._4_4_ * auVar210._4_4_;
      auVar43._0_4_ = auVar158._0_4_ * auVar210._0_4_;
      auVar43._8_4_ = auVar158._8_4_ * auVar210._8_4_;
      auVar43._12_4_ = auVar158._12_4_ * auVar210._12_4_;
      auVar43._16_4_ = auVar158._16_4_ * auVar210._16_4_;
      auVar43._20_4_ = auVar158._20_4_ * auVar210._20_4_;
      auVar43._24_4_ = auVar158._24_4_ * auVar210._24_4_;
      auVar43._28_4_ = auVar193._28_4_;
      auVar8 = vfmsub231ps_fma(auVar43,auVar115,auVar124);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
      auVar120._0_4_ = auVar124._0_4_ * auVar179._0_4_;
      auVar120._4_4_ = auVar124._4_4_ * auVar179._4_4_;
      auVar120._8_4_ = auVar124._8_4_ * auVar179._8_4_;
      auVar120._12_4_ = auVar124._12_4_ * auVar179._12_4_;
      auVar120._16_4_ = auVar124._16_4_ * auVar179._16_4_;
      auVar120._20_4_ = auVar124._20_4_ * auVar179._20_4_;
      auVar120._24_4_ = auVar124._24_4_ * auVar179._24_4_;
      auVar120._28_4_ = 0;
      auVar8 = vfmsub231ps_fma(auVar120,auVar210,auVar212);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
      auVar121._0_4_ = auVar164._0_4_ * auVar125._0_4_;
      auVar121._4_4_ = auVar164._4_4_ * auVar125._4_4_;
      auVar121._8_4_ = auVar164._8_4_ * auVar125._8_4_;
      auVar121._12_4_ = auVar164._12_4_ * auVar125._12_4_;
      auVar121._16_4_ = auVar164._16_4_ * auVar125._16_4_;
      auVar121._20_4_ = auVar164._20_4_ * auVar125._20_4_;
      auVar121._24_4_ = auVar164._24_4_ * auVar125._24_4_;
      auVar121._28_4_ = 0;
      auVar7 = vfmsub231ps_fma(auVar121,auVar136,auVar203);
      auVar44._4_4_ = auVar137._4_4_ * auVar203._4_4_;
      auVar44._0_4_ = auVar137._0_4_ * auVar203._0_4_;
      auVar44._8_4_ = auVar137._8_4_ * auVar203._8_4_;
      auVar44._12_4_ = auVar137._12_4_ * auVar203._12_4_;
      auVar44._16_4_ = auVar137._16_4_ * auVar203._16_4_;
      auVar44._20_4_ = auVar137._20_4_ * auVar203._20_4_;
      auVar44._24_4_ = auVar137._24_4_ * auVar203._24_4_;
      auVar44._28_4_ = auVar203._28_4_;
      auVar9 = vfmsub231ps_fma(auVar44,auVar144,auVar164);
      auVar45._4_4_ = auVar136._4_4_ * auVar144._4_4_;
      auVar45._0_4_ = auVar136._0_4_ * auVar144._0_4_;
      auVar45._8_4_ = auVar136._8_4_ * auVar144._8_4_;
      auVar45._12_4_ = auVar136._12_4_ * auVar144._12_4_;
      auVar45._16_4_ = auVar136._16_4_ * auVar144._16_4_;
      auVar45._20_4_ = auVar136._20_4_ * auVar144._20_4_;
      auVar45._24_4_ = auVar136._24_4_ * auVar144._24_4_;
      auVar45._28_4_ = auVar144._28_4_;
      auVar13 = vfmsub231ps_fma(auVar45,auVar137,auVar125);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
      auVar125 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
      auVar125 = vcmpps_avx(auVar125,ZEXT832(0) << 0x20,2);
      auVar7 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
      auVar6 = vpand_avx(auVar7,auVar6);
      auVar125 = vpmovsxwd_avx2(auVar6);
      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0x7f,0) == '\0') &&
            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0xbf,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar125[0x1f]) {
        auVar161 = ZEXT864(0) << 0x20;
LAB_0146a883:
        auVar192 = ZEXT3264(CONCAT824(uStack_588,
                                      CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
      }
      else {
        auVar46._4_4_ = auVar124._4_4_ * auVar164._4_4_;
        auVar46._0_4_ = auVar124._0_4_ * auVar164._0_4_;
        auVar46._8_4_ = auVar124._8_4_ * auVar164._8_4_;
        auVar46._12_4_ = auVar124._12_4_ * auVar164._12_4_;
        auVar46._16_4_ = auVar124._16_4_ * auVar164._16_4_;
        auVar46._20_4_ = auVar124._20_4_ * auVar164._20_4_;
        auVar46._24_4_ = auVar124._24_4_ * auVar164._24_4_;
        auVar46._28_4_ = auVar125._28_4_;
        auVar209 = vfmsub231ps_fma(auVar46,auVar137,auVar212);
        auVar142._0_4_ = auVar212._0_4_ * auVar136._0_4_;
        auVar142._4_4_ = auVar212._4_4_ * auVar136._4_4_;
        auVar142._8_4_ = auVar212._8_4_ * auVar136._8_4_;
        auVar142._12_4_ = auVar212._12_4_ * auVar136._12_4_;
        auVar142._16_4_ = auVar212._16_4_ * auVar136._16_4_;
        auVar142._20_4_ = auVar212._20_4_ * auVar136._20_4_;
        auVar142._24_4_ = auVar212._24_4_ * auVar136._24_4_;
        auVar142._28_4_ = 0;
        auVar188 = vfmsub231ps_fma(auVar142,auVar158,auVar164);
        auVar47._4_4_ = auVar158._4_4_ * auVar137._4_4_;
        auVar47._0_4_ = auVar158._0_4_ * auVar137._0_4_;
        auVar47._8_4_ = auVar158._8_4_ * auVar137._8_4_;
        auVar47._12_4_ = auVar158._12_4_ * auVar137._12_4_;
        auVar47._16_4_ = auVar158._16_4_ * auVar137._16_4_;
        auVar47._20_4_ = auVar158._20_4_ * auVar137._20_4_;
        auVar47._24_4_ = auVar158._24_4_ * auVar137._24_4_;
        auVar47._28_4_ = auVar158._28_4_;
        auVar111 = vfmsub231ps_fma(auVar47,auVar136,auVar124);
        auVar7 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar188),ZEXT1632(auVar111));
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar209),_DAT_01f7b000);
        auVar125 = vrcpps_avx(ZEXT1632(auVar13));
        auVar211._8_4_ = 0x3f800000;
        auVar211._0_8_ = 0x3f8000003f800000;
        auVar211._12_4_ = 0x3f800000;
        auVar211._16_4_ = 0x3f800000;
        auVar211._20_4_ = 0x3f800000;
        auVar211._24_4_ = 0x3f800000;
        auVar211._28_4_ = 0x3f800000;
        auVar7 = vfnmadd213ps_fma(auVar125,ZEXT1632(auVar13),auVar211);
        auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar125,auVar125);
        auVar48._4_4_ = auVar111._4_4_ * auVar179._4_4_;
        auVar48._0_4_ = auVar111._0_4_ * auVar179._0_4_;
        auVar48._8_4_ = auVar111._8_4_ * auVar179._8_4_;
        auVar48._12_4_ = auVar111._12_4_ * auVar179._12_4_;
        auVar48._16_4_ = auVar179._16_4_ * 0.0;
        auVar48._20_4_ = auVar179._20_4_ * 0.0;
        auVar48._24_4_ = auVar179._24_4_ * 0.0;
        auVar48._28_4_ = auVar179._28_4_;
        auVar188 = vfmadd231ps_fma(auVar48,ZEXT1632(auVar188),auVar210);
        auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),ZEXT1632(auVar209),auVar115);
        fVar148 = auVar7._0_4_;
        fVar126 = auVar7._4_4_;
        fVar127 = auVar7._8_4_;
        fVar128 = auVar7._12_4_;
        auVar179 = ZEXT1632(CONCAT412(fVar128 * auVar188._12_4_,
                                      CONCAT48(fVar127 * auVar188._8_4_,
                                               CONCAT44(fVar126 * auVar188._4_4_,
                                                        fVar148 * auVar188._0_4_))));
        auVar122._4_4_ = uVar107;
        auVar122._0_4_ = uVar107;
        auVar122._8_4_ = uVar107;
        auVar122._12_4_ = uVar107;
        auVar122._16_4_ = uVar107;
        auVar122._20_4_ = uVar107;
        auVar122._24_4_ = uVar107;
        auVar122._28_4_ = uVar107;
        uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar143._4_4_ = uVar104;
        auVar143._0_4_ = uVar104;
        auVar143._8_4_ = uVar104;
        auVar143._12_4_ = uVar104;
        auVar143._16_4_ = uVar104;
        auVar143._20_4_ = uVar104;
        auVar143._24_4_ = uVar104;
        auVar143._28_4_ = uVar104;
        auVar115 = vcmpps_avx(auVar122,auVar179,2);
        auVar210 = vcmpps_avx(auVar179,auVar143,2);
        auVar115 = vandps_avx(auVar210,auVar115);
        auVar7 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar6 = vpand_avx(auVar6,auVar7);
        auVar115 = vpmovsxwd_avx2(auVar6);
        auVar161 = ZEXT864(0) << 0x20;
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar115[0x1f]) goto LAB_0146a883;
        auVar115 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar13),4);
        auVar7 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar6 = vpand_avx(auVar6,auVar7);
        auVar115 = vpmovsxwd_avx2(auVar6);
        auVar192 = ZEXT3264(CONCAT824(uStack_588,
                                      CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar115 >> 0x7f,0) != '\0') ||
              (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0xbf,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar115[0x1f] < '\0') {
          auVar125 = ZEXT1632(CONCAT412(fVar128 * auVar8._12_4_,
                                        CONCAT48(fVar127 * auVar8._8_4_,
                                                 CONCAT44(fVar126 * auVar8._4_4_,
                                                          fVar148 * auVar8._0_4_))));
          auVar144 = ZEXT1632(CONCAT412(fVar128 * auVar9._12_4_,
                                        CONCAT48(fVar127 * auVar9._8_4_,
                                                 CONCAT44(fVar126 * auVar9._4_4_,
                                                          fVar148 * auVar9._0_4_))));
          auVar174._8_4_ = 0x3f800000;
          auVar174._0_8_ = 0x3f8000003f800000;
          auVar174._12_4_ = 0x3f800000;
          auVar174._16_4_ = 0x3f800000;
          auVar174._20_4_ = 0x3f800000;
          auVar174._24_4_ = 0x3f800000;
          auVar174._28_4_ = 0x3f800000;
          auVar210 = vsubps_avx(auVar174,auVar125);
          _local_360 = vblendvps_avx(auVar210,auVar125,auVar139);
          auVar210 = vsubps_avx(auVar174,auVar144);
          local_4e0 = vblendvps_avx(auVar210,auVar144,auVar139);
          auVar192 = ZEXT3264(auVar115);
          local_380 = auVar179;
        }
      }
      auVar204 = ZEXT3264(auVar230);
      auVar115 = auVar192._0_32_;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0x7f,0) == '\0') &&
            (auVar192 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar115 >> 0xbf,0) == '\0') &&
          (auVar192 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar192[0x1f]) {
        uVar105 = 0;
        auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,CONCAT416(fVar218,
                                                  CONCAT412(fVar220,CONCAT48(fVar218,uVar110)))))));
        auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,CONCAT416(fVar187,
                                                  CONCAT412(fVar187,CONCAT48(fVar187,CONCAT44(
                                                  fVar187,fVar187))))))));
      }
      else {
        auVar210 = vsubps_avx(ZEXT1632(auVar186),auVar146);
        auVar6 = vfmadd213ps_fma(auVar210,_local_360,auVar146);
        fVar148 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar49._4_4_ = (auVar6._4_4_ + auVar6._4_4_) * fVar148;
        auVar49._0_4_ = (auVar6._0_4_ + auVar6._0_4_) * fVar148;
        auVar49._8_4_ = (auVar6._8_4_ + auVar6._8_4_) * fVar148;
        auVar49._12_4_ = (auVar6._12_4_ + auVar6._12_4_) * fVar148;
        auVar49._16_4_ = fVar148 * 0.0;
        auVar49._20_4_ = fVar148 * 0.0;
        auVar49._24_4_ = fVar148 * 0.0;
        auVar49._28_4_ = 0;
        auVar210 = vcmpps_avx(local_380,auVar49,6);
        auVar179 = auVar115 & auVar210;
        auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,CONCAT416(fVar187,
                                                  CONCAT412(fVar187,CONCAT48(fVar187,CONCAT44(
                                                  fVar187,fVar187))))))));
        if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar179 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar179 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar179 >> 0x7f,0) == '\0') &&
              (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar179 >> 0xbf,0) == '\0') &&
            (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar179[0x1f]) {
          uVar105 = 0;
          auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,CONCAT416(
                                                  fVar218,CONCAT412(fVar220,CONCAT48(fVar218,uVar110
                                                                                    )))))));
        }
        else {
          auVar145._8_4_ = 0xbf800000;
          auVar145._0_8_ = 0xbf800000bf800000;
          auVar145._12_4_ = 0xbf800000;
          auVar145._16_4_ = 0xbf800000;
          auVar145._20_4_ = 0xbf800000;
          auVar145._24_4_ = 0xbf800000;
          auVar145._28_4_ = 0xbf800000;
          auVar156._8_4_ = 0x40000000;
          auVar156._0_8_ = 0x4000000040000000;
          auVar156._12_4_ = 0x40000000;
          auVar156._16_4_ = 0x40000000;
          auVar156._20_4_ = 0x40000000;
          auVar156._24_4_ = 0x40000000;
          auVar156._28_4_ = 0x40000000;
          auVar6 = vfmadd213ps_fma(local_4e0,auVar156,auVar145);
          local_340 = _local_360;
          local_320 = ZEXT1632(auVar6);
          local_300 = local_380;
          local_2e0 = 0;
          local_2d0 = local_6f0;
          uStack_2c8 = uStack_6e8;
          local_2c0 = local_700;
          uStack_2b8 = uStack_6f8;
          local_2b0 = local_710;
          uStack_2a8 = uStack_708;
          local_4e0 = local_320;
          if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            uVar105 = 0;
            auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,CONCAT416(
                                                  fVar218,CONCAT412(fVar220,CONCAT48(fVar218,uVar110
                                                                                    )))))));
          }
          else {
            auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,CONCAT416(
                                                  fVar218,CONCAT412(fVar220,CONCAT48(fVar218,uVar110
                                                                                    )))))));
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar105 = CONCAT71((int7)(uVar105 >> 8),1),
               pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar115 = vandps_avx(auVar210,auVar115);
              fVar148 = 1.0 / auVar118._0_4_;
              local_260[0] = fVar148 * ((float)local_360._0_4_ + 0.0);
              local_260[1] = fVar148 * ((float)local_360._4_4_ + 1.0);
              local_260[2] = fVar148 * (fStack_358 + 2.0);
              local_260[3] = fVar148 * (fStack_354 + 3.0);
              fStack_250 = fVar148 * (fStack_350 + 4.0);
              fStack_24c = fVar148 * (fStack_34c + 5.0);
              fStack_248 = fVar148 * (fStack_348 + 6.0);
              fStack_244 = fStack_344 + 7.0;
              local_4e0._0_8_ = auVar6._0_8_;
              local_4e0._8_8_ = auVar6._8_8_;
              local_240 = local_4e0._0_8_;
              uStack_238 = local_4e0._8_8_;
              uStack_230 = 0;
              uStack_228 = 0;
              local_220 = local_380;
              uVar104 = vmovmskps_avx(auVar115);
              uVar102 = 0;
              uVar106 = CONCAT44((int)(uVar105 >> 0x20),uVar104);
              for (uVar105 = uVar106; (uVar105 & 1) == 0;
                  uVar105 = uVar105 >> 1 | 0x8000000000000000) {
                uVar102 = uVar102 + 1;
              }
              local_600._4_4_ = uVar100;
              local_600._0_4_ = uVar100;
              local_600._8_4_ = uVar100;
              local_600._12_4_ = uVar100;
              local_600._16_4_ = uVar100;
              local_600._20_4_ = uVar100;
              local_600._24_4_ = uVar100;
              local_600._28_4_ = uVar100;
              local_620._0_4_ = local_620._4_4_;
              local_620._8_4_ = local_620._4_4_;
              local_620._12_4_ = local_620._4_4_;
              local_620._16_4_ = local_620._4_4_;
              local_620._20_4_ = local_620._4_4_;
              local_620._24_4_ = local_620._4_4_;
              local_620._28_4_ = local_620._4_4_;
              auVar115 = vpcmpeqd_avx2(auVar225,auVar225);
              auVar195 = ZEXT3264(auVar115);
              local_680 = auVar230;
              local_660 = uVar133;
              uStack_658 = uVar133;
              uStack_650 = uVar133;
              uStack_648 = uVar133;
              local_640 = uVar109;
              uStack_638 = uVar109;
              uStack_630 = uVar109;
              uStack_628 = uVar109;
              local_2dc = iVar96;
              while (auVar230 = auVar204._0_32_, uVar106 != 0) {
                uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
                fVar148 = local_260[uVar102];
                auVar112._4_4_ = fVar148;
                auVar112._0_4_ = fVar148;
                auVar112._8_4_ = fVar148;
                auVar112._12_4_ = fVar148;
                local_1a0._16_4_ = fVar148;
                local_1a0._0_16_ = auVar112;
                local_1a0._20_4_ = fVar148;
                local_1a0._24_4_ = fVar148;
                local_1a0._28_4_ = fVar148;
                local_180 = *(undefined4 *)((long)&local_240 + uVar102 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_220 + uVar102 * 4);
                fVar126 = 1.0 - fVar148;
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar112,ZEXT416(0xc0a00000)
                                        );
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * 3.0)),
                                         ZEXT416((uint)(fVar148 + fVar148)),auVar6);
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar112,ZEXT416(0x40000000)
                                        );
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar126 * fVar126 * -3.0)),
                                         ZEXT416((uint)(fVar126 + fVar126)),auVar6);
                auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar148 * (fVar126 + fVar126))),
                                          ZEXT416((uint)fVar126),ZEXT416((uint)fVar126));
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148)),auVar112,
                                         ZEXT416((uint)(fVar126 * -2.0)));
                fVar148 = auVar6._0_4_ * 0.5;
                fVar126 = auVar8._0_4_ * 0.5;
                auVar168._0_4_ = fVar126 * (float)local_5c0._0_4_;
                auVar168._4_4_ = fVar126 * (float)local_5c0._4_4_;
                auVar168._8_4_ = fVar126 * fStack_5b8;
                auVar168._12_4_ = fVar126 * fStack_5b4;
                auVar151._4_4_ = fVar148;
                auVar151._0_4_ = fVar148;
                auVar151._8_4_ = fVar148;
                auVar151._12_4_ = fVar148;
                auVar6 = vfmadd132ps_fma(auVar151,auVar168,auVar12);
                fVar148 = auVar7._0_4_ * 0.5;
                auVar169._4_4_ = fVar148;
                auVar169._0_4_ = fVar148;
                auVar169._8_4_ = fVar148;
                auVar169._12_4_ = fVar148;
                auVar6 = vfmadd132ps_fma(auVar169,auVar6,auVar11);
                local_6d0.context = context->user;
                fVar148 = auVar9._0_4_ * 0.5;
                auVar152._4_4_ = fVar148;
                auVar152._0_4_ = fVar148;
                auVar152._8_4_ = fVar148;
                auVar152._12_4_ = fVar148;
                auVar7 = vfmadd132ps_fma(auVar152,auVar6,auVar10);
                local_200 = auVar7._0_4_;
                uStack_1fc = local_200;
                uStack_1f8 = local_200;
                uStack_1f4 = local_200;
                uStack_1f0 = local_200;
                uStack_1ec = local_200;
                uStack_1e8 = local_200;
                uStack_1e4 = local_200;
                auVar6 = vmovshdup_avx(auVar7);
                local_1e0 = auVar6._0_8_;
                uStack_1d8 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1c8 = local_1e0;
                auVar6 = vshufps_avx(auVar7,auVar7,0xaa);
                local_1c0._8_8_ = auVar6._0_8_;
                local_1c0._0_8_ = local_1c0._8_8_;
                local_1c0._16_8_ = local_1c0._8_8_;
                local_1c0._24_8_ = local_1c0._8_8_;
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = local_620._0_8_;
                uStack_158 = local_620._8_8_;
                uStack_150 = local_620._16_8_;
                uStack_148 = local_620._24_8_;
                local_140 = local_600._0_8_;
                uStack_138 = local_600._8_8_;
                uStack_130 = local_600._16_8_;
                uStack_128 = local_600._24_8_;
                local_120 = (local_6d0.context)->instID[0];
                uStack_11c = local_120;
                uStack_118 = local_120;
                uStack_114 = local_120;
                uStack_110 = local_120;
                uStack_10c = local_120;
                uStack_108 = local_120;
                uStack_104 = local_120;
                local_100 = (local_6d0.context)->instPrimID[0];
                uStack_fc = local_100;
                uStack_f8 = local_100;
                uStack_f4 = local_100;
                uStack_f0 = local_100;
                uStack_ec = local_100;
                uStack_e8 = local_100;
                uStack_e4 = local_100;
                local_5e0 = local_3c0;
                local_6d0.valid = (int *)local_5e0;
                local_6d0.geometryUserPtr = pGVar15->userPtr;
                local_6d0.hit = (RTCHitN *)&local_200;
                local_6d0.N = 8;
                local_6d0.ray = (RTCRayN *)ray;
                if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar115 = ZEXT1632(auVar195._0_16_);
                  (*pGVar15->occlusionFilterN)(&local_6d0);
                  auVar204 = ZEXT3264(local_680);
                  auVar115 = vpcmpeqd_avx2(auVar115,auVar115);
                  auVar195 = ZEXT3264(auVar115);
                  auVar161 = ZEXT1664(ZEXT816(0) << 0x40);
                  uVar109 = local_640;
                  uVar132 = uStack_638;
                  uVar216 = uStack_630;
                  uVar217 = uStack_628;
                  uVar133 = local_660;
                  uVar222 = uStack_658;
                  uVar223 = uStack_650;
                  uVar224 = uStack_648;
                }
                auVar210 = vpcmpeqd_avx2(auVar161._0_32_,local_5e0);
                auVar115 = auVar195._0_32_ & ~auVar210;
                if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar115 >> 0x7f,0) == '\0') &&
                      (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar115 >> 0xbf,0) == '\0') &&
                    (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar115[0x1f]) {
                  auVar210 = auVar195._0_32_ ^ auVar210;
                  auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,
                                                  CONCAT416(fVar218,CONCAT412(fVar220,CONCAT48(
                                                  fVar218,uVar110)))))));
                  auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,
                                                  CONCAT416(fVar187,CONCAT412(fVar187,CONCAT48(
                                                  fVar187,CONCAT44(fVar187,fVar187))))))));
                }
                else {
                  p_Var18 = context->args->filter;
                  if (p_Var18 == (RTCFilterFunctionN)0x0) {
                    auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,
                                                  CONCAT416(fVar218,CONCAT412(fVar220,CONCAT48(
                                                  fVar218,uVar110)))))));
                    auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,
                                                  CONCAT416(fVar187,CONCAT412(fVar187,CONCAT48(
                                                  fVar187,CONCAT44(fVar187,fVar187))))))));
                  }
                  else {
                    auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,
                                                  CONCAT416(fVar218,CONCAT412(fVar220,CONCAT48(
                                                  fVar218,uVar110)))))));
                    auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,
                                                  CONCAT416(fVar187,CONCAT412(fVar187,CONCAT48(
                                                  fVar187,CONCAT44(fVar187,fVar187))))))));
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                      auVar115 = ZEXT1632(auVar195._0_16_);
                      (*p_Var18)(&local_6d0);
                      auVar204 = ZEXT3264(local_680);
                      auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,
                                                  CONCAT416(fVar187,CONCAT412(fVar187,CONCAT48(
                                                  fVar187,CONCAT44(fVar187,fVar187))))))));
                      auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,
                                                  CONCAT416(fVar218,CONCAT412(fVar220,CONCAT48(
                                                  fVar218,uVar110)))))));
                      auVar115 = vpcmpeqd_avx2(auVar115,auVar115);
                      auVar195 = ZEXT3264(auVar115);
                      auVar161 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar109 = local_640;
                      uVar132 = uStack_638;
                      uVar216 = uStack_630;
                      uVar217 = uStack_628;
                      uVar133 = local_660;
                      uVar222 = uStack_658;
                      uVar223 = uStack_650;
                      uVar224 = uStack_648;
                    }
                  }
                  auVar115 = vpcmpeqd_avx2(auVar161._0_32_,local_5e0);
                  auVar210 = auVar195._0_32_ ^ auVar115;
                  auVar157._8_4_ = 0xff800000;
                  auVar157._0_8_ = 0xff800000ff800000;
                  auVar157._12_4_ = 0xff800000;
                  auVar157._16_4_ = 0xff800000;
                  auVar157._20_4_ = 0xff800000;
                  auVar157._24_4_ = 0xff800000;
                  auVar157._28_4_ = 0xff800000;
                  auVar115 = vblendvps_avx(auVar157,*(undefined1 (*) [32])(local_6d0.ray + 0x100),
                                           auVar115);
                  *(undefined1 (*) [32])(local_6d0.ray + 0x100) = auVar115;
                }
                auVar230 = auVar204._0_32_;
                if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar210 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar210 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar210 >> 0x7f,0) != '\0') ||
                      (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar210 >> 0xbf,0) != '\0') ||
                    (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar210[0x1f] < '\0') {
                  uVar105 = 1;
                  goto LAB_01469a2d;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar104;
                uVar105 = uVar102 & 0x3f;
                uVar102 = 0;
                uVar106 = uVar106 ^ 1L << uVar105;
                for (uVar105 = uVar106; (uVar105 & 1) == 0;
                    uVar105 = uVar105 >> 1 | 0x8000000000000000) {
                  uVar102 = uVar102 + 1;
                }
              }
              uVar105 = 0;
            }
          }
        }
      }
    }
LAB_01469a2d:
    auVar213 = ZEXT3264(auVar213._0_32_);
    auVar208 = ZEXT3264(auVar208._0_32_);
    auVar161 = ZEXT464((uint)fVar149);
    if (8 < iVar96) {
      local_420._4_4_ = iVar96;
      local_420._0_4_ = iVar96;
      local_420._8_4_ = iVar96;
      local_420._12_4_ = iVar96;
      local_420._16_4_ = iVar96;
      local_420._20_4_ = iVar96;
      local_420._24_4_ = iVar96;
      local_420._28_4_ = iVar96;
      local_480._4_4_ = uVar107;
      local_480._0_4_ = uVar107;
      local_480._8_4_ = uVar107;
      local_480._12_4_ = uVar107;
      local_480._16_4_ = uVar107;
      local_480._20_4_ = uVar107;
      local_480._24_4_ = uVar107;
      local_480._28_4_ = uVar107;
      local_4c0._4_4_ = 1.0 / (float)local_540._0_4_;
      local_4c0._0_4_ = local_4c0._4_4_;
      fStack_4b8 = (float)local_4c0._4_4_;
      fStack_4b4 = (float)local_4c0._4_4_;
      fStack_4b0 = (float)local_4c0._4_4_;
      fStack_4ac = (float)local_4c0._4_4_;
      fStack_4a8 = (float)local_4c0._4_4_;
      fStack_4a4 = (float)local_4c0._4_4_;
      local_4a0._4_4_ = uVar100;
      local_4a0._0_4_ = uVar100;
      local_4a0._8_4_ = uVar100;
      local_4a0._12_4_ = uVar100;
      local_4a0._16_4_ = uVar100;
      local_4a0._20_4_ = uVar100;
      local_4a0._24_4_ = uVar100;
      local_4a0._28_4_ = uVar100;
      local_540._4_4_ = local_6a0._0_4_;
      local_540._0_4_ = local_6a0._0_4_;
      uStack_538._0_4_ = local_6a0._0_4_;
      uStack_538._4_4_ = local_6a0._0_4_;
      uStack_530 = local_6a0._0_4_;
      uStack_52c = local_6a0._0_4_;
      uStack_528 = local_6a0._0_4_;
      uStack_524 = local_6a0._0_4_;
      local_680 = auVar230;
      local_660 = uVar133;
      uStack_658 = uVar222;
      uStack_650 = uVar223;
      uStack_648 = uVar224;
      local_640 = uVar109;
      uStack_638 = uVar132;
      uStack_630 = uVar216;
      uStack_628 = uVar217;
      local_460 = fVar149;
      fStack_45c = fVar149;
      fStack_458 = fVar149;
      fStack_454 = fVar149;
      fStack_450 = fVar149;
      fStack_44c = fVar149;
      fStack_448 = fVar149;
      fStack_444 = fVar149;
      for (lVar108 = 8; lVar108 < iVar96; lVar108 = lVar108 + 8) {
        auVar212 = auVar213._0_32_;
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar108 * 4 + lVar101);
        auVar210 = *(undefined1 (*) [32])(lVar101 + 0x22047f0 + lVar108 * 4);
        auVar179 = *(undefined1 (*) [32])(lVar101 + 0x2204c74 + lVar108 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar101 + 0x22050f8 + lVar108 * 4);
        fVar131 = *(float *)*pauVar2;
        fVar219 = *(float *)(*pauVar2 + 4);
        fVar81 = *(float *)(*pauVar2 + 8);
        fVar82 = *(float *)(*pauVar2 + 0xc);
        fVar83 = *(float *)(*pauVar2 + 0x10);
        fVar84 = *(float *)(*pauVar2 + 0x14);
        fVar85 = *(float *)(*pauVar2 + 0x18);
        auVar93 = *(undefined1 (*) [28])*pauVar2;
        _local_6a0 = *pauVar2;
        auVar195._0_4_ = fVar131 * auVar192._0_4_;
        auVar195._4_4_ = fVar219 * auVar192._4_4_;
        auVar195._8_4_ = fVar81 * auVar192._8_4_;
        auVar195._12_4_ = fVar82 * auVar192._12_4_;
        auVar195._16_4_ = fVar83 * auVar192._16_4_;
        auVar195._20_4_ = fVar84 * auVar192._20_4_;
        auVar195._28_36_ = auVar213._28_36_;
        auVar195._24_4_ = fVar85 * auVar192._24_4_;
        auVar213._0_4_ = fVar131 * auVar185._0_4_;
        auVar213._4_4_ = fVar219 * auVar185._4_4_;
        auVar213._8_4_ = fVar81 * auVar185._8_4_;
        auVar213._12_4_ = fVar82 * auVar185._12_4_;
        auVar213._16_4_ = fVar83 * auVar185._16_4_;
        auVar213._20_4_ = fVar84 * auVar185._20_4_;
        auVar213._28_36_ = auVar161._28_36_;
        auVar213._24_4_ = fVar85 * auVar185._24_4_;
        auVar6 = vfmadd231ps_fma(auVar195._0_32_,auVar179,auVar173);
        auVar7 = vfmadd231ps_fma(auVar213._0_32_,auVar179,auVar214);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar210,auVar225);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar210,local_3e0);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar115,auVar207);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar115,local_580);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar108 * 4 + lVar101);
        auVar144 = *(undefined1 (*) [32])(lVar101 + 0x2206c10 + lVar108 * 4);
        auVar203 = *(undefined1 (*) [32])(lVar101 + 0x2207094 + lVar108 * 4);
        pauVar3 = (undefined1 (*) [28])(lVar101 + 0x2207518 + lVar108 * 4);
        fVar86 = *(float *)*pauVar3;
        fVar87 = *(float *)(*pauVar3 + 4);
        fVar221 = *(float *)(*pauVar3 + 8);
        fVar88 = *(float *)(*pauVar3 + 0xc);
        fVar89 = *(float *)(*pauVar3 + 0x10);
        fVar90 = *(float *)(*pauVar3 + 0x14);
        fVar91 = *(float *)(*pauVar3 + 0x18);
        auVar94 = *pauVar3;
        auVar204._0_4_ = auVar192._0_4_ * fVar86;
        auVar204._4_4_ = auVar192._4_4_ * fVar87;
        auVar204._8_4_ = auVar192._8_4_ * fVar221;
        auVar204._12_4_ = auVar192._12_4_ * fVar88;
        auVar204._16_4_ = auVar192._16_4_ * fVar89;
        auVar204._20_4_ = auVar192._20_4_ * fVar90;
        auVar204._28_36_ = auVar192._28_36_;
        auVar204._24_4_ = auVar192._24_4_ * fVar91;
        auVar161._0_4_ = auVar185._0_4_ * fVar86;
        auVar161._4_4_ = auVar185._4_4_ * fVar87;
        auVar161._8_4_ = auVar185._8_4_ * fVar221;
        auVar161._12_4_ = auVar185._12_4_ * fVar88;
        auVar161._16_4_ = auVar185._16_4_ * fVar89;
        auVar161._20_4_ = auVar185._20_4_ * fVar90;
        auVar161._28_36_ = auVar185._28_36_;
        auVar161._24_4_ = auVar185._24_4_ * fVar91;
        auVar8 = vfmadd231ps_fma(auVar204._0_32_,auVar203,auVar173);
        auVar9 = vfmadd231ps_fma(auVar161._0_32_,auVar203,auVar214);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar144,auVar225);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar144,local_3e0);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar125,auVar207);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar125,local_580);
        auVar136 = ZEXT1632(auVar6);
        auVar124 = vsubps_avx(ZEXT1632(auVar8),auVar136);
        local_600 = ZEXT1632(auVar9);
        auVar158 = ZEXT1632(auVar7);
        local_620 = vsubps_avx(local_600,auVar158);
        auVar50._4_4_ = auVar124._4_4_ * auVar7._4_4_;
        auVar50._0_4_ = auVar124._0_4_ * auVar7._0_4_;
        auVar50._8_4_ = auVar124._8_4_ * auVar7._8_4_;
        auVar50._12_4_ = auVar124._12_4_ * auVar7._12_4_;
        auVar50._16_4_ = auVar124._16_4_ * 0.0;
        auVar50._20_4_ = auVar124._20_4_ * 0.0;
        auVar50._24_4_ = auVar124._24_4_ * 0.0;
        auVar50._28_4_ = local_580._28_4_;
        fVar149 = local_620._0_4_;
        fVar148 = local_620._4_4_;
        auVar95._4_4_ = auVar6._4_4_ * fVar148;
        auVar95._0_4_ = auVar6._0_4_ * fVar149;
        fVar126 = local_620._8_4_;
        auVar95._8_4_ = auVar6._8_4_ * fVar126;
        fVar127 = local_620._12_4_;
        auVar95._12_4_ = auVar6._12_4_ * fVar127;
        fVar128 = local_620._16_4_;
        auVar95._16_4_ = fVar128 * 0.0;
        fVar129 = local_620._20_4_;
        auVar95._20_4_ = fVar129 * 0.0;
        fVar130 = local_620._24_4_;
        auVar95._24_4_ = fVar130 * 0.0;
        auVar95._28_4_ = uVar196;
        auVar114 = vsubps_avx(auVar50,auVar95);
        auVar51._4_4_ = local_640._4_4_ * fVar219;
        auVar51._0_4_ = (float)local_640 * fVar131;
        auVar51._8_4_ = (float)uStack_638 * fVar81;
        auVar51._12_4_ = uStack_638._4_4_ * fVar82;
        auVar51._16_4_ = (float)uStack_630 * fVar83;
        auVar51._20_4_ = uStack_630._4_4_ * fVar84;
        auVar51._24_4_ = (float)uStack_628 * fVar85;
        auVar51._28_4_ = uVar196;
        auVar6 = vfmadd231ps_fma(auVar51,local_e0,auVar179);
        auVar161 = ZEXT3264(local_c0);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),local_c0,auVar210);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),local_a0,auVar115);
        auVar52._4_4_ = local_640._4_4_ * fVar87;
        auVar52._0_4_ = (float)local_640 * fVar86;
        auVar52._8_4_ = (float)uStack_638 * fVar221;
        auVar52._12_4_ = uStack_638._4_4_ * fVar88;
        auVar52._16_4_ = (float)uStack_630 * fVar89;
        auVar52._20_4_ = uStack_630._4_4_ * fVar90;
        auVar52._24_4_ = (float)uStack_628 * fVar91;
        auVar52._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
        auVar7 = vfmadd231ps_fma(auVar52,auVar203,local_e0);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar144,local_c0);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar125,local_a0);
        auVar80._4_4_ = fVar148 * fVar148;
        auVar80._0_4_ = fVar149 * fVar149;
        auVar80._8_4_ = fVar126 * fVar126;
        auVar80._12_4_ = fVar127 * fVar127;
        auVar80._16_4_ = fVar128 * fVar128;
        auVar80._20_4_ = fVar129 * fVar129;
        auVar80._24_4_ = fVar130 * fVar130;
        auVar80._28_4_ = local_3e0._28_4_;
        auVar9 = vfmadd231ps_fma(auVar80,auVar124,auVar124);
        auVar137 = ZEXT1632(auVar7);
        auVar193 = vmaxps_avx(ZEXT1632(auVar6),auVar137);
        auVar201._0_4_ = auVar193._0_4_ * auVar193._0_4_ * auVar9._0_4_;
        auVar201._4_4_ = auVar193._4_4_ * auVar193._4_4_ * auVar9._4_4_;
        auVar201._8_4_ = auVar193._8_4_ * auVar193._8_4_ * auVar9._8_4_;
        auVar201._12_4_ = auVar193._12_4_ * auVar193._12_4_ * auVar9._12_4_;
        auVar201._16_4_ = auVar193._16_4_ * auVar193._16_4_ * 0.0;
        auVar201._20_4_ = auVar193._20_4_ * auVar193._20_4_ * 0.0;
        auVar201._24_4_ = auVar193._24_4_ * auVar193._24_4_ * 0.0;
        auVar201._28_4_ = 0;
        auVar53._4_4_ = auVar114._4_4_ * auVar114._4_4_;
        auVar53._0_4_ = auVar114._0_4_ * auVar114._0_4_;
        auVar53._8_4_ = auVar114._8_4_ * auVar114._8_4_;
        auVar53._12_4_ = auVar114._12_4_ * auVar114._12_4_;
        auVar53._16_4_ = auVar114._16_4_ * auVar114._16_4_;
        auVar53._20_4_ = auVar114._20_4_ * auVar114._20_4_;
        auVar53._24_4_ = auVar114._24_4_ * auVar114._24_4_;
        auVar53._28_4_ = auVar114._28_4_;
        auVar193 = vcmpps_avx(auVar53,auVar201,2);
        local_2e0 = (int)lVar108;
        auVar202._4_4_ = local_2e0;
        auVar202._0_4_ = local_2e0;
        auVar202._8_4_ = local_2e0;
        auVar202._12_4_ = local_2e0;
        auVar202._16_4_ = local_2e0;
        auVar202._20_4_ = local_2e0;
        auVar202._24_4_ = local_2e0;
        auVar202._28_4_ = local_2e0;
        auVar114 = vpor_avx2(auVar202,_DAT_01fb4ba0);
        auVar139 = vpcmpgtd_avx2(local_420,auVar114);
        auVar114 = auVar139 & auVar193;
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0x7f,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar114 >> 0xbf,0) == '\0') &&
            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar114[0x1f]) {
          auVar213 = ZEXT3264(auVar212);
          auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,CONCAT416(
                                                  fVar218,CONCAT412(fVar220,CONCAT48(fVar218,uVar110
                                                                                    )))))));
          auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,CONCAT416(
                                                  fVar187,CONCAT412(fVar187,CONCAT48(fVar187,
                                                  CONCAT44(fVar187,fVar187))))))));
        }
        else {
          local_440 = vandps_avx(auVar139,auVar193);
          local_560._0_4_ = auVar94._0_4_;
          local_560._4_4_ = auVar94._4_4_;
          fStack_558 = auVar94._8_4_;
          fStack_554 = auVar94._12_4_;
          fStack_550 = auVar94._16_4_;
          fStack_54c = auVar94._20_4_;
          fStack_548 = auVar94._24_4_;
          auVar54._4_4_ = local_660._4_4_ * (float)local_560._4_4_;
          auVar54._0_4_ = (float)local_660 * (float)local_560._0_4_;
          auVar54._8_4_ = (float)uStack_658 * fStack_558;
          auVar54._12_4_ = uStack_658._4_4_ * fStack_554;
          auVar54._16_4_ = (float)uStack_650 * fStack_550;
          auVar54._20_4_ = uStack_650._4_4_ * fStack_54c;
          auVar54._24_4_ = (float)uStack_648 * fStack_548;
          auVar54._28_4_ = auVar193._28_4_;
          auVar7 = vfmadd213ps_fma(auVar203,local_520,auVar54);
          auVar7 = vfmadd213ps_fma(auVar144,local_400,ZEXT1632(auVar7));
          auVar7 = vfmadd132ps_fma(auVar125,ZEXT1632(auVar7),local_680);
          _local_560 = ZEXT1632(auVar7);
          local_6a0._0_4_ = auVar93._0_4_;
          local_6a0._4_4_ = auVar93._4_4_;
          fStack_698 = auVar93._8_4_;
          fStack_694 = auVar93._12_4_;
          fStack_690 = auVar93._16_4_;
          fStack_68c = auVar93._20_4_;
          fStack_688 = auVar93._24_4_;
          auVar55._4_4_ = local_660._4_4_ * (float)local_6a0._4_4_;
          auVar55._0_4_ = (float)local_660 * (float)local_6a0._0_4_;
          auVar55._8_4_ = (float)uStack_658 * fStack_698;
          auVar55._12_4_ = uStack_658._4_4_ * fStack_694;
          auVar55._16_4_ = (float)uStack_650 * fStack_690;
          auVar55._20_4_ = uStack_650._4_4_ * fStack_68c;
          auVar55._24_4_ = (float)uStack_648 * fStack_688;
          auVar55._28_4_ = auVar193._28_4_;
          auVar7 = vfmadd213ps_fma(auVar179,local_520,auVar55);
          auVar7 = vfmadd213ps_fma(auVar210,local_400,ZEXT1632(auVar7));
          auVar210 = *(undefined1 (*) [32])(lVar101 + 0x220557c + lVar108 * 4);
          auVar179 = *(undefined1 (*) [32])(lVar101 + 0x2205a00 + lVar108 * 4);
          auVar144 = *(undefined1 (*) [32])(lVar101 + 0x2205e84 + lVar108 * 4);
          pfVar1 = (float *)(lVar101 + 0x2206308 + lVar108 * 4);
          fVar149 = *pfVar1;
          fVar148 = pfVar1[1];
          fVar126 = pfVar1[2];
          fVar127 = pfVar1[3];
          fVar128 = pfVar1[4];
          fVar129 = pfVar1[5];
          fVar130 = pfVar1[6];
          auVar56._4_4_ = fVar148 * fVar187;
          auVar56._0_4_ = fVar149 * fVar187;
          auVar56._8_4_ = fVar126 * fVar187;
          auVar56._12_4_ = fVar127 * fVar187;
          auVar56._16_4_ = fVar128 * fVar187;
          auVar56._20_4_ = fVar129 * fVar187;
          auVar56._24_4_ = fVar130 * fVar187;
          auVar56._28_4_ = auVar124._28_4_;
          auVar57._4_4_ = fVar148 * fVar220;
          auVar57._0_4_ = fVar149 * fVar218;
          auVar57._8_4_ = fVar126 * fVar218;
          auVar57._12_4_ = fVar127 * fVar220;
          auVar57._16_4_ = fVar128 * fVar218;
          auVar57._20_4_ = fVar129 * fVar220;
          auVar57._24_4_ = fVar130 * fVar218;
          auVar57._28_4_ = auVar125._28_4_;
          auVar58._4_4_ = fVar148 * local_660._4_4_;
          auVar58._0_4_ = fVar149 * (float)local_660;
          auVar58._8_4_ = fVar126 * (float)uStack_658;
          auVar58._12_4_ = fVar127 * uStack_658._4_4_;
          auVar58._16_4_ = fVar128 * (float)uStack_650;
          auVar58._20_4_ = fVar129 * uStack_650._4_4_;
          auVar58._24_4_ = fVar130 * (float)uStack_648;
          auVar58._28_4_ = pfVar1[7];
          auVar9 = vfmadd231ps_fma(auVar56,auVar144,auVar173);
          auVar186 = vfmadd231ps_fma(auVar57,auVar144,auVar214);
          auVar13 = vfmadd231ps_fma(auVar58,local_520,auVar144);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar179,auVar225);
          auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar179,local_3e0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_400,auVar179);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar210,auVar207);
          auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar210,local_580);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar210,local_680);
          pfVar1 = (float *)(lVar101 + 0x2208728 + lVar108 * 4);
          fVar149 = *pfVar1;
          fVar148 = pfVar1[1];
          fVar126 = pfVar1[2];
          fVar127 = pfVar1[3];
          fVar128 = pfVar1[4];
          fVar129 = pfVar1[5];
          fVar130 = pfVar1[6];
          auVar226._0_4_ = fVar187 * fVar149;
          auVar226._4_4_ = fVar187 * fVar148;
          auVar226._8_4_ = fVar187 * fVar126;
          auVar226._12_4_ = fVar187 * fVar127;
          auVar226._16_4_ = fVar187 * fVar128;
          auVar226._20_4_ = fVar187 * fVar129;
          auVar226._24_4_ = fVar187 * fVar130;
          auVar226._28_4_ = 0;
          auVar59._4_4_ = fVar220 * fVar148;
          auVar59._0_4_ = fVar218 * fVar149;
          auVar59._8_4_ = fVar218 * fVar126;
          auVar59._12_4_ = fVar220 * fVar127;
          auVar59._16_4_ = fVar218 * fVar128;
          auVar59._20_4_ = fVar220 * fVar129;
          auVar59._24_4_ = fVar218 * fVar130;
          auVar59._28_4_ = local_3e0._28_4_;
          auVar60._4_4_ = fVar148 * local_660._4_4_;
          auVar60._0_4_ = fVar149 * (float)local_660;
          auVar60._8_4_ = fVar126 * (float)uStack_658;
          auVar60._12_4_ = fVar127 * uStack_658._4_4_;
          auVar60._16_4_ = fVar128 * (float)uStack_650;
          auVar60._20_4_ = fVar129 * uStack_650._4_4_;
          auVar60._24_4_ = fVar130 * (float)uStack_648;
          auVar60._28_4_ = pfVar1[7];
          auVar210 = *(undefined1 (*) [32])(lVar101 + 0x22082a4 + lVar108 * 4);
          auVar188 = vfmadd231ps_fma(auVar226,auVar210,auVar173);
          auVar209 = vfmadd231ps_fma(auVar59,auVar210,auVar214);
          auVar111 = vfmadd231ps_fma(auVar60,local_520,auVar210);
          auVar210 = *(undefined1 (*) [32])(lVar101 + 0x2207e20 + lVar108 * 4);
          auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar210,auVar225);
          auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar210,local_3e0);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_400,auVar210);
          auVar210 = *(undefined1 (*) [32])(lVar101 + 0x220799c + lVar108 * 4);
          auVar188 = vfmadd231ps_fma(ZEXT1632(auVar188),auVar210,auVar207);
          auVar209 = vfmadd231ps_fma(ZEXT1632(auVar209),auVar210,local_580);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_680,auVar210);
          auVar210 = vandps_avx(ZEXT1632(auVar9),local_3a0);
          auVar179 = vandps_avx(ZEXT1632(auVar186),local_3a0);
          auVar179 = vmaxps_avx(auVar210,auVar179);
          auVar210 = vandps_avx(ZEXT1632(auVar13),local_3a0);
          auVar210 = vmaxps_avx(auVar179,auVar210);
          auVar92._4_4_ = fStack_45c;
          auVar92._0_4_ = local_460;
          auVar92._8_4_ = fStack_458;
          auVar92._12_4_ = fStack_454;
          auVar92._16_4_ = fStack_450;
          auVar92._20_4_ = fStack_44c;
          auVar92._24_4_ = fStack_448;
          auVar92._28_4_ = fStack_444;
          auVar210 = vcmpps_avx(auVar210,auVar92,1);
          auVar125 = vblendvps_avx(ZEXT1632(auVar9),auVar124,auVar210);
          auVar144 = vblendvps_avx(ZEXT1632(auVar186),local_620,auVar210);
          auVar210 = vandps_avx(ZEXT1632(auVar188),local_3a0);
          auVar179 = vandps_avx(ZEXT1632(auVar209),local_3a0);
          auVar179 = vmaxps_avx(auVar210,auVar179);
          auVar210 = vandps_avx(local_3a0,ZEXT1632(auVar111));
          auVar210 = vmaxps_avx(auVar179,auVar210);
          auVar179 = vcmpps_avx(auVar210,auVar92,1);
          auVar210 = vblendvps_avx(ZEXT1632(auVar188),auVar124,auVar179);
          auVar179 = vblendvps_avx(ZEXT1632(auVar209),local_620,auVar179);
          auVar7 = vfmadd213ps_fma(auVar115,local_680,ZEXT1632(auVar7));
          auVar9 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar144,auVar144);
          auVar115 = vrsqrtps_avx(ZEXT1632(auVar9));
          fVar149 = auVar115._0_4_;
          fVar148 = auVar115._4_4_;
          fVar126 = auVar115._8_4_;
          fVar127 = auVar115._12_4_;
          fVar128 = auVar115._16_4_;
          fVar129 = auVar115._20_4_;
          fVar130 = auVar115._24_4_;
          auVar61._4_4_ = fVar148 * fVar148 * fVar148 * auVar9._4_4_ * -0.5;
          auVar61._0_4_ = fVar149 * fVar149 * fVar149 * auVar9._0_4_ * -0.5;
          auVar61._8_4_ = fVar126 * fVar126 * fVar126 * auVar9._8_4_ * -0.5;
          auVar61._12_4_ = fVar127 * fVar127 * fVar127 * auVar9._12_4_ * -0.5;
          auVar61._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
          auVar61._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
          auVar61._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
          auVar61._28_4_ = 0;
          auVar227._8_4_ = 0x3fc00000;
          auVar227._0_8_ = 0x3fc000003fc00000;
          auVar227._12_4_ = 0x3fc00000;
          auVar227._16_4_ = 0x3fc00000;
          auVar227._20_4_ = 0x3fc00000;
          auVar227._24_4_ = 0x3fc00000;
          auVar227._28_4_ = 0x3fc00000;
          auVar9 = vfmadd231ps_fma(auVar61,auVar227,auVar115);
          fVar149 = auVar9._0_4_;
          fVar148 = auVar9._4_4_;
          auVar62._4_4_ = auVar144._4_4_ * fVar148;
          auVar62._0_4_ = auVar144._0_4_ * fVar149;
          fVar126 = auVar9._8_4_;
          auVar62._8_4_ = auVar144._8_4_ * fVar126;
          fVar127 = auVar9._12_4_;
          auVar62._12_4_ = auVar144._12_4_ * fVar127;
          auVar62._16_4_ = auVar144._16_4_ * 0.0;
          auVar62._20_4_ = auVar144._20_4_ * 0.0;
          auVar62._24_4_ = auVar144._24_4_ * 0.0;
          auVar62._28_4_ = auVar144._28_4_;
          auVar63._4_4_ = fVar148 * -auVar125._4_4_;
          auVar63._0_4_ = fVar149 * -auVar125._0_4_;
          auVar63._8_4_ = fVar126 * -auVar125._8_4_;
          auVar63._12_4_ = fVar127 * -auVar125._12_4_;
          auVar63._16_4_ = -auVar125._16_4_ * 0.0;
          auVar63._20_4_ = -auVar125._20_4_ * 0.0;
          auVar63._24_4_ = -auVar125._24_4_ * 0.0;
          auVar63._28_4_ = auVar115._28_4_;
          auVar9 = vfmadd213ps_fma(auVar210,auVar210,ZEXT832(0) << 0x20);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar179,auVar179);
          auVar115 = vrsqrtps_avx(ZEXT1632(auVar9));
          auVar64._28_4_ = auVar124._28_4_;
          auVar64._0_28_ =
               ZEXT1628(CONCAT412(fVar127 * 0.0,
                                  CONCAT48(fVar126 * 0.0,CONCAT44(fVar148 * 0.0,fVar149 * 0.0))));
          fVar149 = auVar115._0_4_;
          fVar148 = auVar115._4_4_;
          fVar126 = auVar115._8_4_;
          fVar127 = auVar115._12_4_;
          fVar128 = auVar115._16_4_;
          fVar129 = auVar115._20_4_;
          fVar130 = auVar115._24_4_;
          auVar65._4_4_ = fVar148 * fVar148 * fVar148 * auVar9._4_4_ * -0.5;
          auVar65._0_4_ = fVar149 * fVar149 * fVar149 * auVar9._0_4_ * -0.5;
          auVar65._8_4_ = fVar126 * fVar126 * fVar126 * auVar9._8_4_ * -0.5;
          auVar65._12_4_ = fVar127 * fVar127 * fVar127 * auVar9._12_4_ * -0.5;
          auVar65._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
          auVar65._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
          auVar65._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
          auVar65._28_4_ = 0;
          auVar9 = vfmadd231ps_fma(auVar65,auVar227,auVar115);
          fVar149 = auVar9._0_4_;
          fVar148 = auVar9._4_4_;
          auVar66._4_4_ = auVar179._4_4_ * fVar148;
          auVar66._0_4_ = auVar179._0_4_ * fVar149;
          fVar126 = auVar9._8_4_;
          auVar66._8_4_ = auVar179._8_4_ * fVar126;
          fVar127 = auVar9._12_4_;
          auVar66._12_4_ = auVar179._12_4_ * fVar127;
          auVar66._16_4_ = auVar179._16_4_ * 0.0;
          auVar66._20_4_ = auVar179._20_4_ * 0.0;
          auVar66._24_4_ = auVar179._24_4_ * 0.0;
          auVar66._28_4_ = 0;
          auVar67._4_4_ = fVar148 * -auVar210._4_4_;
          auVar67._0_4_ = fVar149 * -auVar210._0_4_;
          auVar67._8_4_ = fVar126 * -auVar210._8_4_;
          auVar67._12_4_ = fVar127 * -auVar210._12_4_;
          auVar67._16_4_ = -auVar210._16_4_ * 0.0;
          auVar67._20_4_ = -auVar210._20_4_ * 0.0;
          auVar67._24_4_ = -auVar210._24_4_ * 0.0;
          auVar67._28_4_ = auVar115._28_4_;
          auVar68._28_4_ = 0xbf000000;
          auVar68._0_28_ =
               ZEXT1628(CONCAT412(fVar127 * 0.0,
                                  CONCAT48(fVar126 * 0.0,CONCAT44(fVar148 * 0.0,fVar149 * 0.0))));
          auVar9 = vfmadd213ps_fma(auVar62,ZEXT1632(auVar6),auVar136);
          auVar146 = ZEXT1632(auVar6);
          auVar6 = vfmadd213ps_fma(auVar63,auVar146,auVar158);
          auVar186 = vfmadd213ps_fma(auVar64,auVar146,ZEXT1632(auVar7));
          auVar111 = vfnmadd213ps_fma(auVar62,auVar146,auVar136);
          auVar13 = vfmadd213ps_fma(auVar66,auVar137,ZEXT1632(auVar8));
          auVar134 = vfnmadd213ps_fma(auVar63,auVar146,auVar158);
          auVar188 = vfmadd213ps_fma(auVar67,auVar137,local_600);
          auVar162 = vfnmadd231ps_fma(ZEXT1632(auVar7),auVar146,auVar64);
          auVar7 = vfmadd213ps_fma(auVar68,auVar137,_local_560);
          auVar135 = vfnmadd213ps_fma(auVar66,auVar137,ZEXT1632(auVar8));
          auVar150 = vfnmadd213ps_fma(auVar67,auVar137,local_600);
          auVar163 = vfnmadd231ps_fma(_local_560,auVar137,auVar68);
          auVar115 = vsubps_avx(ZEXT1632(auVar188),ZEXT1632(auVar134));
          auVar210 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar162));
          auVar69._4_4_ = auVar115._4_4_ * auVar162._4_4_;
          auVar69._0_4_ = auVar115._0_4_ * auVar162._0_4_;
          auVar69._8_4_ = auVar115._8_4_ * auVar162._8_4_;
          auVar69._12_4_ = auVar115._12_4_ * auVar162._12_4_;
          auVar69._16_4_ = auVar115._16_4_ * 0.0;
          auVar69._20_4_ = auVar115._20_4_ * 0.0;
          auVar69._24_4_ = auVar115._24_4_ * 0.0;
          auVar69._28_4_ = 0;
          auVar209 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar134),auVar210);
          auVar70._4_4_ = auVar111._4_4_ * auVar210._4_4_;
          auVar70._0_4_ = auVar111._0_4_ * auVar210._0_4_;
          auVar70._8_4_ = auVar111._8_4_ * auVar210._8_4_;
          auVar70._12_4_ = auVar111._12_4_ * auVar210._12_4_;
          auVar70._16_4_ = auVar210._16_4_ * 0.0;
          auVar70._20_4_ = auVar210._20_4_ * 0.0;
          auVar70._24_4_ = auVar210._24_4_ * 0.0;
          auVar70._28_4_ = auVar210._28_4_;
          auVar203 = ZEXT1632(auVar111);
          auVar210 = vsubps_avx(ZEXT1632(auVar13),auVar203);
          auVar124 = ZEXT1632(auVar162);
          auVar8 = vfmsub231ps_fma(auVar70,auVar124,auVar210);
          auVar71._4_4_ = auVar134._4_4_ * auVar210._4_4_;
          auVar71._0_4_ = auVar134._0_4_ * auVar210._0_4_;
          auVar71._8_4_ = auVar134._8_4_ * auVar210._8_4_;
          auVar71._12_4_ = auVar134._12_4_ * auVar210._12_4_;
          auVar71._16_4_ = auVar210._16_4_ * 0.0;
          auVar71._20_4_ = auVar210._20_4_ * 0.0;
          auVar71._24_4_ = auVar210._24_4_ * 0.0;
          auVar71._28_4_ = auVar210._28_4_;
          auVar111 = vfmsub231ps_fma(auVar71,auVar203,auVar115);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar111),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar209));
          auVar114 = vcmpps_avx(ZEXT1632(auVar8),ZEXT832(0) << 0x20,2);
          auVar115 = vblendvps_avx(ZEXT1632(auVar135),ZEXT1632(auVar9),auVar114);
          auVar210 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar6),auVar114);
          _local_6a0 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar186),auVar114);
          auVar179 = vblendvps_avx(auVar203,ZEXT1632(auVar13),auVar114);
          auVar125 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar188),auVar114);
          auVar144 = vblendvps_avx(auVar124,ZEXT1632(auVar7),auVar114);
          auVar203 = vblendvps_avx(ZEXT1632(auVar13),auVar203,auVar114);
          auVar193 = vblendvps_avx(ZEXT1632(auVar188),ZEXT1632(auVar134),auVar114);
          auVar6 = vpackssdw_avx(local_440._0_16_,local_440._16_16_);
          auVar124 = vblendvps_avx(ZEXT1632(auVar7),auVar124,auVar114);
          auVar203 = vsubps_avx(auVar203,auVar115);
          auVar193 = vsubps_avx(auVar193,auVar210);
          auVar139 = vsubps_avx(auVar124,_local_6a0);
          auVar158 = vsubps_avx(auVar115,auVar179);
          auVar136 = vsubps_avx(auVar210,auVar125);
          auVar164 = vsubps_avx(_local_6a0,auVar144);
          auVar176._0_4_ = auVar139._0_4_ * auVar115._0_4_;
          auVar176._4_4_ = auVar139._4_4_ * auVar115._4_4_;
          auVar176._8_4_ = auVar139._8_4_ * auVar115._8_4_;
          auVar176._12_4_ = auVar139._12_4_ * auVar115._12_4_;
          auVar176._16_4_ = auVar139._16_4_ * auVar115._16_4_;
          auVar176._20_4_ = auVar139._20_4_ * auVar115._20_4_;
          auVar176._24_4_ = auVar139._24_4_ * auVar115._24_4_;
          auVar176._28_4_ = 0;
          auVar7 = vfmsub231ps_fma(auVar176,_local_6a0,auVar203);
          auVar72._4_4_ = auVar203._4_4_ * auVar210._4_4_;
          auVar72._0_4_ = auVar203._0_4_ * auVar210._0_4_;
          auVar72._8_4_ = auVar203._8_4_ * auVar210._8_4_;
          auVar72._12_4_ = auVar203._12_4_ * auVar210._12_4_;
          auVar72._16_4_ = auVar203._16_4_ * auVar210._16_4_;
          auVar72._20_4_ = auVar203._20_4_ * auVar210._20_4_;
          auVar72._24_4_ = auVar203._24_4_ * auVar210._24_4_;
          auVar72._28_4_ = auVar124._28_4_;
          auVar8 = vfmsub231ps_fma(auVar72,auVar115,auVar193);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
          auVar177._0_4_ = auVar193._0_4_ * local_6a0._0_4_;
          auVar177._4_4_ = auVar193._4_4_ * local_6a0._4_4_;
          auVar177._8_4_ = auVar193._8_4_ * local_6a0._8_4_;
          auVar177._12_4_ = auVar193._12_4_ * local_6a0._12_4_;
          auVar177._16_4_ = auVar193._16_4_ * local_6a0._16_4_;
          auVar177._20_4_ = auVar193._20_4_ * local_6a0._20_4_;
          auVar177._24_4_ = auVar193._24_4_ * local_6a0._24_4_;
          auVar177._28_4_ = 0;
          auVar8 = vfmsub231ps_fma(auVar177,auVar210,auVar139);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
          auVar161 = ZEXT1664(auVar8);
          auVar178._0_4_ = auVar164._0_4_ * auVar179._0_4_;
          auVar178._4_4_ = auVar164._4_4_ * auVar179._4_4_;
          auVar178._8_4_ = auVar164._8_4_ * auVar179._8_4_;
          auVar178._12_4_ = auVar164._12_4_ * auVar179._12_4_;
          auVar178._16_4_ = auVar164._16_4_ * auVar179._16_4_;
          auVar178._20_4_ = auVar164._20_4_ * auVar179._20_4_;
          auVar178._24_4_ = auVar164._24_4_ * auVar179._24_4_;
          auVar178._28_4_ = 0;
          auVar7 = vfmsub231ps_fma(auVar178,auVar158,auVar144);
          auVar73._4_4_ = auVar136._4_4_ * auVar144._4_4_;
          auVar73._0_4_ = auVar136._0_4_ * auVar144._0_4_;
          auVar73._8_4_ = auVar136._8_4_ * auVar144._8_4_;
          auVar73._12_4_ = auVar136._12_4_ * auVar144._12_4_;
          auVar73._16_4_ = auVar136._16_4_ * auVar144._16_4_;
          auVar73._20_4_ = auVar136._20_4_ * auVar144._20_4_;
          auVar73._24_4_ = auVar136._24_4_ * auVar144._24_4_;
          auVar73._28_4_ = auVar115._28_4_;
          auVar9 = vfmsub231ps_fma(auVar73,auVar125,auVar164);
          auVar74._4_4_ = auVar158._4_4_ * auVar125._4_4_;
          auVar74._0_4_ = auVar158._0_4_ * auVar125._0_4_;
          auVar74._8_4_ = auVar158._8_4_ * auVar125._8_4_;
          auVar74._12_4_ = auVar158._12_4_ * auVar125._12_4_;
          auVar74._16_4_ = auVar158._16_4_ * auVar125._16_4_;
          auVar74._20_4_ = auVar158._20_4_ * auVar125._20_4_;
          auVar74._24_4_ = auVar158._24_4_ * auVar125._24_4_;
          auVar74._28_4_ = auVar125._28_4_;
          auVar186 = vfmsub231ps_fma(auVar74,auVar136,auVar179);
          auVar125 = ZEXT832(0) << 0x20;
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar125,ZEXT1632(auVar7));
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar125,ZEXT1632(auVar9));
          auVar179 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
          auVar179 = vcmpps_avx(auVar179,auVar125,2);
          auVar7 = vpackssdw_avx(auVar179._0_16_,auVar179._16_16_);
          auVar6 = vpand_avx(auVar7,auVar6);
          auVar179 = vpmovsxwd_avx2(auVar6);
          if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar179 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar179 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar179 >> 0x7f,0) == '\0') &&
                (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar179 >> 0xbf,0) == '\0') &&
              (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar179[0x1f]) {
LAB_0146a7ca:
            auVar166._8_8_ = uStack_598;
            auVar166._0_8_ = local_5a0;
            auVar166._16_8_ = uStack_590;
            auVar166._24_8_ = uStack_588;
            auVar115 = vpcmpeqd_avx2(auVar203,auVar203);
            auVar204 = ZEXT3264(auVar115);
            auVar208 = ZEXT3264(auVar208._0_32_);
            auVar213 = ZEXT3264(auVar212);
          }
          else {
            auVar75._4_4_ = auVar193._4_4_ * auVar164._4_4_;
            auVar75._0_4_ = auVar193._0_4_ * auVar164._0_4_;
            auVar75._8_4_ = auVar193._8_4_ * auVar164._8_4_;
            auVar75._12_4_ = auVar193._12_4_ * auVar164._12_4_;
            auVar75._16_4_ = auVar193._16_4_ * auVar164._16_4_;
            auVar75._20_4_ = auVar193._20_4_ * auVar164._20_4_;
            auVar75._24_4_ = auVar193._24_4_ * auVar164._24_4_;
            auVar75._28_4_ = auVar179._28_4_;
            auVar188 = vfmsub231ps_fma(auVar75,auVar136,auVar139);
            auVar184._0_4_ = auVar139._0_4_ * auVar158._0_4_;
            auVar184._4_4_ = auVar139._4_4_ * auVar158._4_4_;
            auVar184._8_4_ = auVar139._8_4_ * auVar158._8_4_;
            auVar184._12_4_ = auVar139._12_4_ * auVar158._12_4_;
            auVar184._16_4_ = auVar139._16_4_ * auVar158._16_4_;
            auVar184._20_4_ = auVar139._20_4_ * auVar158._20_4_;
            auVar184._24_4_ = auVar139._24_4_ * auVar158._24_4_;
            auVar184._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar184,auVar203,auVar164);
            auVar76._4_4_ = auVar203._4_4_ * auVar136._4_4_;
            auVar76._0_4_ = auVar203._0_4_ * auVar136._0_4_;
            auVar76._8_4_ = auVar203._8_4_ * auVar136._8_4_;
            auVar76._12_4_ = auVar203._12_4_ * auVar136._12_4_;
            auVar76._16_4_ = auVar203._16_4_ * auVar136._16_4_;
            auVar76._20_4_ = auVar203._20_4_ * auVar136._20_4_;
            auVar76._24_4_ = auVar203._24_4_ * auVar136._24_4_;
            auVar76._28_4_ = auVar136._28_4_;
            auVar209 = vfmsub231ps_fma(auVar76,auVar158,auVar193);
            auVar7 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar13),ZEXT1632(auVar209));
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar188),auVar125);
            auVar203 = ZEXT1632(auVar186);
            auVar179 = vrcpps_avx(ZEXT1632(auVar186));
            auVar215._8_4_ = 0x3f800000;
            auVar215._0_8_ = 0x3f8000003f800000;
            auVar215._12_4_ = 0x3f800000;
            auVar215._16_4_ = 0x3f800000;
            auVar215._20_4_ = 0x3f800000;
            auVar215._24_4_ = 0x3f800000;
            auVar215._28_4_ = 0x3f800000;
            auVar7 = vfnmadd213ps_fma(auVar179,ZEXT1632(auVar186),auVar215);
            auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar179,auVar179);
            auVar77._4_4_ = auVar209._4_4_ * local_6a0._4_4_;
            auVar77._0_4_ = auVar209._0_4_ * local_6a0._0_4_;
            auVar77._8_4_ = auVar209._8_4_ * local_6a0._8_4_;
            auVar77._12_4_ = auVar209._12_4_ * local_6a0._12_4_;
            auVar77._16_4_ = local_6a0._16_4_ * 0.0;
            auVar77._20_4_ = local_6a0._20_4_ * 0.0;
            auVar77._24_4_ = local_6a0._24_4_ * 0.0;
            auVar77._28_4_ = auVar210._28_4_;
            auVar13 = vfmadd231ps_fma(auVar77,ZEXT1632(auVar13),auVar210);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar188),auVar115);
            fVar149 = auVar7._0_4_;
            fVar148 = auVar7._4_4_;
            fVar126 = auVar7._8_4_;
            fVar127 = auVar7._12_4_;
            auVar179 = ZEXT1632(CONCAT412(fVar127 * auVar13._12_4_,
                                          CONCAT48(fVar126 * auVar13._8_4_,
                                                   CONCAT44(fVar148 * auVar13._4_4_,
                                                            fVar149 * auVar13._0_4_))));
            uVar107 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar165._4_4_ = uVar107;
            auVar165._0_4_ = uVar107;
            auVar165._8_4_ = uVar107;
            auVar165._12_4_ = uVar107;
            auVar165._16_4_ = uVar107;
            auVar165._20_4_ = uVar107;
            auVar165._24_4_ = uVar107;
            auVar165._28_4_ = uVar107;
            auVar115 = vcmpps_avx(local_480,auVar179,2);
            auVar210 = vcmpps_avx(auVar179,auVar165,2);
            auVar115 = vandps_avx(auVar210,auVar115);
            auVar7 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
            auVar6 = vpand_avx(auVar6,auVar7);
            auVar115 = vpmovsxwd_avx2(auVar6);
            if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0x7f,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0xbf,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar115[0x1f]) goto LAB_0146a7ca;
            auVar115 = vcmpps_avx(ZEXT1632(auVar186),ZEXT832(0) << 0x20,4);
            auVar186 = auVar115._16_16_;
            auVar7 = vpackssdw_avx(auVar115._0_16_,auVar186);
            auVar6 = vpand_avx(auVar6,auVar7);
            auVar210 = vpmovsxwd_avx2(auVar6);
            auVar166._8_8_ = uStack_598;
            auVar166._0_8_ = local_5a0;
            auVar166._16_8_ = uStack_590;
            auVar166._24_8_ = uStack_588;
            auVar115 = vpcmpeqd_avx2(ZEXT1632(auVar186),ZEXT1632(auVar186));
            auVar204 = ZEXT3264(auVar115);
            auVar208 = ZEXT3264(auVar208._0_32_);
            auVar213 = ZEXT3264(auVar212);
            if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar210 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar210 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar210 >> 0x7f,0) != '\0') ||
                  (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar210 >> 0xbf,0) != '\0') ||
                (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar210[0x1f] < '\0') {
              auVar125 = ZEXT1632(CONCAT412(fVar127 * auVar8._12_4_,
                                            CONCAT48(fVar126 * auVar8._8_4_,
                                                     CONCAT44(fVar148 * auVar8._4_4_,
                                                              fVar149 * auVar8._0_4_))));
              auVar78._28_4_ = SUB84(uStack_588,4);
              auVar78._0_28_ =
                   ZEXT1628(CONCAT412(fVar127 * auVar9._12_4_,
                                      CONCAT48(fVar126 * auVar9._8_4_,
                                               CONCAT44(fVar148 * auVar9._4_4_,
                                                        fVar149 * auVar9._0_4_))));
              auVar194._8_4_ = 0x3f800000;
              auVar194._0_8_ = 0x3f8000003f800000;
              auVar194._12_4_ = 0x3f800000;
              auVar194._16_4_ = 0x3f800000;
              auVar194._20_4_ = 0x3f800000;
              auVar194._24_4_ = 0x3f800000;
              auVar194._28_4_ = 0x3f800000;
              auVar115 = vsubps_avx(auVar194,auVar125);
              auVar115 = vblendvps_avx(auVar115,auVar125,auVar114);
              auVar208 = ZEXT3264(auVar115);
              auVar115 = vsubps_avx(auVar194,auVar78);
              local_500 = vblendvps_avx(auVar115,auVar78,auVar114);
              auVar161 = ZEXT3264(local_500);
              auVar213 = ZEXT3264(auVar179);
              auVar166 = auVar210;
            }
          }
          if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar166 >> 0x7f,0) == '\0') &&
                (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar166 >> 0xbf,0) == '\0') &&
              (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar166[0x1f]) {
            auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,CONCAT416(
                                                  fVar218,CONCAT412(fVar220,CONCAT48(fVar218,uVar110
                                                                                    )))))));
            auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,CONCAT416(
                                                  fVar187,CONCAT412(fVar187,CONCAT48(fVar187,
                                                  CONCAT44(fVar187,fVar187))))))));
          }
          else {
            auVar115 = vsubps_avx(auVar137,auVar146);
            auVar179 = auVar208._0_32_;
            auVar6 = vfmadd213ps_fma(auVar115,auVar179,auVar146);
            fVar149 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar79._4_4_ = (auVar6._4_4_ + auVar6._4_4_) * fVar149;
            auVar79._0_4_ = (auVar6._0_4_ + auVar6._0_4_) * fVar149;
            auVar79._8_4_ = (auVar6._8_4_ + auVar6._8_4_) * fVar149;
            auVar79._12_4_ = (auVar6._12_4_ + auVar6._12_4_) * fVar149;
            auVar79._16_4_ = fVar149 * 0.0;
            auVar79._20_4_ = fVar149 * 0.0;
            auVar79._24_4_ = fVar149 * 0.0;
            auVar79._28_4_ = fVar149;
            auVar125 = auVar213._0_32_;
            auVar115 = vcmpps_avx(auVar125,auVar79,6);
            auVar210 = auVar166 & auVar115;
            auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,CONCAT416(
                                                  fVar218,CONCAT412(fVar220,CONCAT48(fVar218,uVar110
                                                                                    )))))));
            auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,CONCAT416(
                                                  fVar187,CONCAT412(fVar187,CONCAT48(fVar187,
                                                  CONCAT44(fVar187,fVar187))))))));
            if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar210 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar210 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar210 >> 0x7f,0) != '\0') ||
                  (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar210 >> 0xbf,0) != '\0') ||
                (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar210[0x1f] < '\0') {
              auVar147._8_4_ = 0xbf800000;
              auVar147._0_8_ = 0xbf800000bf800000;
              auVar147._12_4_ = 0xbf800000;
              auVar147._16_4_ = 0xbf800000;
              auVar147._20_4_ = 0xbf800000;
              auVar147._24_4_ = 0xbf800000;
              auVar147._28_4_ = 0xbf800000;
              auVar159._8_4_ = 0x40000000;
              auVar159._0_8_ = 0x4000000040000000;
              auVar159._12_4_ = 0x40000000;
              auVar159._16_4_ = 0x40000000;
              auVar159._20_4_ = 0x40000000;
              auVar159._24_4_ = 0x40000000;
              auVar159._28_4_ = 0x40000000;
              auVar161 = ZEXT3264(auVar159);
              auVar6 = vfmadd213ps_fma(local_500,auVar159,auVar147);
              local_320 = ZEXT1632(auVar6);
              local_2d0 = local_6f0;
              uStack_2c8 = uStack_6e8;
              local_2c0 = local_700;
              uStack_2b8 = uStack_6f8;
              local_2b0 = local_710;
              uStack_2a8 = uStack_708;
              pGVar15 = (context->scene->geometries).items[uVar100].ptr;
              local_500 = local_320;
              if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar98 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar98 = context->args;
                if ((pRVar98->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar98 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar98 >> 8),1),
                   pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar115 = vandps_avx(auVar115,auVar166);
                  fVar149 = (float)local_2e0;
                  auVar161 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar149,CONCAT420(fVar149,
                                                  CONCAT416(fVar149,CONCAT412(fVar149,CONCAT48(
                                                  fVar149,CONCAT44(fVar149,fVar149))))))));
                  local_260[0] = (fVar149 + auVar208._0_4_ + 0.0) * (float)local_4c0._0_4_;
                  local_260[1] = (fVar149 + auVar208._4_4_ + 1.0) * (float)local_4c0._4_4_;
                  local_260[2] = (fVar149 + auVar208._8_4_ + 2.0) * fStack_4b8;
                  local_260[3] = (fVar149 + auVar208._12_4_ + 3.0) * fStack_4b4;
                  fStack_250 = (fVar149 + auVar208._16_4_ + 4.0) * fStack_4b0;
                  fStack_24c = (fVar149 + auVar208._20_4_ + 5.0) * fStack_4ac;
                  fStack_248 = (fVar149 + auVar208._24_4_ + 6.0) * fStack_4a8;
                  fStack_244 = fVar149 + auVar208._28_4_ + 7.0;
                  local_500._0_8_ = auVar6._0_8_;
                  local_500._8_8_ = auVar6._8_8_;
                  local_240 = local_500._0_8_;
                  uStack_238 = local_500._8_8_;
                  uStack_230 = 0;
                  uStack_228 = 0;
                  local_220 = auVar125;
                  uVar107 = vmovmskps_avx(auVar115);
                  uVar102 = 0;
                  uVar99 = CONCAT44((int)((ulong)pRVar98 >> 0x20),uVar107);
                  for (uVar106 = uVar99; local_340 = auVar179, local_300 = auVar125,
                      local_2dc = iVar96, (uVar106 & 1) == 0;
                      uVar106 = uVar106 >> 1 | 0x8000000000000000) {
                    uVar102 = uVar102 + 1;
                  }
                  while (auVar115 = auVar204._0_32_, uVar99 != 0) {
                    uVar107 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar149 = local_260[uVar102];
                    auVar113._4_4_ = fVar149;
                    auVar113._0_4_ = fVar149;
                    auVar113._8_4_ = fVar149;
                    auVar113._12_4_ = fVar149;
                    local_1a0._16_4_ = fVar149;
                    local_1a0._0_16_ = auVar113;
                    local_1a0._20_4_ = fVar149;
                    local_1a0._24_4_ = fVar149;
                    local_1a0._28_4_ = fVar149;
                    local_180 = *(undefined4 *)((long)&local_240 + uVar102 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_220 + uVar102 * 4);
                    fVar148 = 1.0 - fVar149;
                    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar113,
                                             ZEXT416(0xc0a00000));
                    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149 * 3.0)),
                                             ZEXT416((uint)(fVar149 + fVar149)),auVar6);
                    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar113,
                                             ZEXT416(0x40000000));
                    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar148 * fVar148 * -3.0)),
                                             ZEXT416((uint)(fVar148 + fVar148)),auVar6);
                    auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar149 * (fVar148 + fVar148))),
                                              ZEXT416((uint)fVar148),ZEXT416((uint)fVar148));
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),auVar113,
                                             ZEXT416((uint)(fVar148 * -2.0)));
                    fVar149 = auVar6._0_4_ * 0.5;
                    fVar148 = auVar8._0_4_ * 0.5;
                    auVar170._0_4_ = fVar148 * (float)local_5c0._0_4_;
                    auVar170._4_4_ = fVar148 * (float)local_5c0._4_4_;
                    auVar170._8_4_ = fVar148 * fStack_5b8;
                    auVar170._12_4_ = fVar148 * fStack_5b4;
                    auVar153._4_4_ = fVar149;
                    auVar153._0_4_ = fVar149;
                    auVar153._8_4_ = fVar149;
                    auVar153._12_4_ = fVar149;
                    auVar6 = vfmadd132ps_fma(auVar153,auVar170,auVar12);
                    fVar149 = auVar7._0_4_ * 0.5;
                    auVar171._4_4_ = fVar149;
                    auVar171._0_4_ = fVar149;
                    auVar171._8_4_ = fVar149;
                    auVar171._12_4_ = fVar149;
                    auVar6 = vfmadd132ps_fma(auVar171,auVar6,auVar11);
                    local_6d0.context = context->user;
                    fVar149 = auVar9._0_4_ * 0.5;
                    auVar154._4_4_ = fVar149;
                    auVar154._0_4_ = fVar149;
                    auVar154._8_4_ = fVar149;
                    auVar154._12_4_ = fVar149;
                    auVar7 = vfmadd132ps_fma(auVar154,auVar6,auVar10);
                    local_200 = auVar7._0_4_;
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    auVar6 = vmovshdup_avx(auVar7);
                    local_1e0 = auVar6._0_8_;
                    uStack_1d8 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1c8 = local_1e0;
                    auVar6 = vshufps_avx(auVar7,auVar7,0xaa);
                    auVar155._0_8_ = auVar6._0_8_;
                    auVar155._8_8_ = auVar155._0_8_;
                    local_1c0._16_8_ = auVar155._0_8_;
                    local_1c0._0_16_ = auVar155;
                    local_1c0._24_8_ = auVar155._0_8_;
                    auVar161 = ZEXT3264(local_1c0);
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = local_540;
                    uStack_158 = uStack_538;
                    uStack_150 = CONCAT44(uStack_52c,uStack_530);
                    uStack_148 = CONCAT44(uStack_524,uStack_528);
                    local_140 = local_4a0._0_8_;
                    uStack_138 = local_4a0._8_8_;
                    uStack_130 = local_4a0._16_8_;
                    uStack_128 = local_4a0._24_8_;
                    local_120 = (local_6d0.context)->instID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_100 = (local_6d0.context)->instPrimID[0];
                    uStack_fc = local_100;
                    uStack_f8 = local_100;
                    uStack_f4 = local_100;
                    uStack_f0 = local_100;
                    uStack_ec = local_100;
                    uStack_e8 = local_100;
                    uStack_e4 = local_100;
                    local_5e0 = local_3c0;
                    local_6d0.valid = (int *)local_5e0;
                    local_6d0.geometryUserPtr = pGVar15->userPtr;
                    local_6d0.hit = (RTCHitN *)&local_200;
                    local_6d0.N = 8;
                    local_6d0.ray = (RTCRayN *)ray;
                    if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar161 = ZEXT1664(auVar155);
                      auVar115 = ZEXT1632(auVar204._0_16_);
                      (*pGVar15->occlusionFilterN)(&local_6d0);
                    }
                    auVar210 = vpcmpeqd_avx2(local_5e0,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar144 = vpcmpeqd_avx2(auVar115,auVar115);
                    auVar115 = auVar144 & ~auVar210;
                    if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar115 >> 0x7f,0) == '\0') &&
                          (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar115 >> 0xbf,0) == '\0') &&
                        (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar115[0x1f]) {
                      auVar210 = auVar144 ^ auVar210;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar144 = ZEXT1632(auVar144._0_16_);
                        (*p_Var18)(&local_6d0);
                      }
                      auVar115 = vpcmpeqd_avx2(local_5e0,SUB6432(ZEXT1664((undefined1  [16])0x0),0))
                      ;
                      auVar144 = vpcmpeqd_avx2(auVar144,auVar144);
                      auVar210 = auVar144 ^ auVar115;
                      auVar160._8_4_ = 0xff800000;
                      auVar160._0_8_ = 0xff800000ff800000;
                      auVar160._12_4_ = 0xff800000;
                      auVar160._16_4_ = 0xff800000;
                      auVar160._20_4_ = 0xff800000;
                      auVar160._24_4_ = 0xff800000;
                      auVar160._28_4_ = 0xff800000;
                      auVar161 = ZEXT3264(auVar160);
                      auVar115 = vblendvps_avx(auVar160,*(undefined1 (*) [32])
                                                         (local_6d0.ray + 0x100),auVar115);
                      *(undefined1 (*) [32])(local_6d0.ray + 0x100) = auVar115;
                    }
                    auVar204 = ZEXT3264(auVar144);
                    if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar210 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar210 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar210 >> 0x7f,0) != '\0') ||
                          (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar210 >> 0xbf,0) != '\0') ||
                        (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar210[0x1f] < '\0') {
                      pRVar98 = (RTCIntersectArguments *)0x1;
                      goto LAB_0146a7fe;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar107;
                    uVar106 = uVar102 & 0x3f;
                    uVar102 = 0;
                    uVar99 = uVar99 ^ 1L << uVar106;
                    for (uVar106 = uVar99; (uVar106 & 1) == 0;
                        uVar106 = uVar106 >> 1 | 0x8000000000000000) {
                      uVar102 = uVar102 + 1;
                    }
                  }
                  pRVar98 = (RTCIntersectArguments *)0x0;
LAB_0146a7fe:
                  auVar208 = ZEXT3264(auVar179);
                  auVar213 = ZEXT3264(auVar125);
                  auVar185 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar218,CONCAT420(fVar220,
                                                  CONCAT416(fVar218,CONCAT412(fVar220,CONCAT48(
                                                  fVar218,uVar110)))))));
                  auVar192 = ZEXT3264(CONCAT428(fVar187,CONCAT424(fVar187,CONCAT420(fVar187,
                                                  CONCAT416(fVar187,CONCAT412(fVar187,CONCAT48(
                                                  fVar187,CONCAT44(fVar187,fVar187))))))));
                }
              }
              uVar105 = (ulong)(byte)((byte)uVar105 | (byte)pRVar98);
            }
          }
        }
      }
    }
    if ((uVar105 & 1) != 0) break;
    uVar107 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar123._4_4_ = uVar107;
    auVar123._0_4_ = uVar107;
    auVar123._8_4_ = uVar107;
    auVar123._12_4_ = uVar107;
    auVar123._16_4_ = uVar107;
    auVar123._20_4_ = uVar107;
    auVar123._24_4_ = uVar107;
    auVar123._28_4_ = uVar107;
    auVar115 = vcmpps_avx(local_80,auVar123,2);
    uVar100 = vmovmskps_avx(auVar115);
  }
  return uVar97 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }